

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined4 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  int iVar75;
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  long lVar80;
  uint uVar81;
  byte bVar82;
  ulong uVar83;
  undefined4 uVar84;
  undefined8 in_R11;
  bool bVar85;
  float fVar86;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar99 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar213;
  float fVar214;
  vint4 bi;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar204 [32];
  float fVar215;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar219;
  float fVar225;
  float fVar226;
  vint4 ai_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar231 [16];
  undefined1 auVar233 [32];
  undefined1 auVar232 [16];
  undefined1 auVar234 [64];
  float fVar235;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [16];
  float fVar242;
  undefined1 auVar238 [32];
  undefined1 auVar237 [16];
  undefined1 auVar239 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [28];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar268;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar269;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float s;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar270 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar275 [16];
  undefined1 auVar281 [64];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ce4;
  uint uStack_c44;
  float local_c00;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined4 local_b20;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [16];
  Primitive *local_998;
  ulong local_990;
  ulong local_988;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined1 local_920 [16];
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [32];
  uint local_7a0;
  uint uStack_79c;
  uint uStack_798;
  uint uStack_794;
  uint uStack_790;
  uint uStack_78c;
  uint uStack_788;
  uint uStack_784;
  uint local_780;
  uint uStack_77c;
  uint uStack_778;
  uint uStack_774;
  uint uStack_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar267 [64];
  undefined1 auVar276 [16];
  
  PVar1 = prim[1];
  uVar78 = (ulong)(byte)PVar1;
  fVar86 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  auVar91._0_4_ = fVar86 * auVar4._0_4_;
  auVar91._4_4_ = fVar86 * auVar4._4_4_;
  auVar91._8_4_ = fVar86 * auVar4._8_4_;
  auVar91._12_4_ = fVar86 * auVar4._12_4_;
  auVar198._0_4_ = fVar86 * auVar5._0_4_;
  auVar198._4_4_ = fVar86 * auVar5._4_4_;
  auVar198._8_4_ = fVar86 * auVar5._8_4_;
  auVar198._12_4_ = fVar86 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xc + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x12 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x13 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x14 + 6)));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar275._4_4_ = auVar198._0_4_;
  auVar275._0_4_ = auVar198._0_4_;
  auVar275._8_4_ = auVar198._0_4_;
  auVar275._12_4_ = auVar198._0_4_;
  auVar120 = vshufps_avx(auVar198,auVar198,0x55);
  auVar87 = vshufps_avx(auVar198,auVar198,0xaa);
  fVar86 = auVar87._0_4_;
  auVar252._0_4_ = fVar86 * auVar6._0_4_;
  fVar118 = auVar87._4_4_;
  auVar252._4_4_ = fVar118 * auVar6._4_4_;
  fVar197 = auVar87._8_4_;
  auVar252._8_4_ = fVar197 * auVar6._8_4_;
  fVar213 = auVar87._12_4_;
  auVar252._12_4_ = fVar213 * auVar6._12_4_;
  auVar243._0_4_ = auVar9._0_4_ * fVar86;
  auVar243._4_4_ = auVar9._4_4_ * fVar118;
  auVar243._8_4_ = auVar9._8_4_ * fVar197;
  auVar243._12_4_ = auVar9._12_4_ * fVar213;
  auVar231._0_4_ = auVar148._0_4_ * fVar86;
  auVar231._4_4_ = auVar148._4_4_ * fVar118;
  auVar231._8_4_ = auVar148._8_4_ * fVar197;
  auVar231._12_4_ = auVar148._12_4_ * fVar213;
  auVar87 = vfmadd231ps_fma(auVar252,auVar120,auVar5);
  auVar143 = vfmadd231ps_fma(auVar243,auVar120,auVar8);
  auVar120 = vfmadd231ps_fma(auVar231,auVar88,auVar120);
  auVar162 = vfmadd231ps_fma(auVar87,auVar275,auVar4);
  auVar143 = vfmadd231ps_fma(auVar143,auVar275,auVar7);
  auVar187 = vfmadd231ps_fma(auVar120,auVar89,auVar275);
  auVar276._4_4_ = auVar91._0_4_;
  auVar276._0_4_ = auVar91._0_4_;
  auVar276._8_4_ = auVar91._0_4_;
  auVar276._12_4_ = auVar91._0_4_;
  auVar281 = ZEXT1664(auVar276);
  auVar120 = vshufps_avx(auVar91,auVar91,0x55);
  auVar287 = ZEXT1664(auVar120);
  auVar87 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar86 = auVar87._0_4_;
  auVar199._0_4_ = fVar86 * auVar6._0_4_;
  fVar118 = auVar87._4_4_;
  auVar199._4_4_ = fVar118 * auVar6._4_4_;
  fVar197 = auVar87._8_4_;
  auVar199._8_4_ = fVar197 * auVar6._8_4_;
  fVar213 = auVar87._12_4_;
  auVar199._12_4_ = fVar213 * auVar6._12_4_;
  auVar119._0_4_ = auVar9._0_4_ * fVar86;
  auVar119._4_4_ = auVar9._4_4_ * fVar118;
  auVar119._8_4_ = auVar9._8_4_ * fVar197;
  auVar119._12_4_ = auVar9._12_4_ * fVar213;
  auVar87._0_4_ = auVar148._0_4_ * fVar86;
  auVar87._4_4_ = auVar148._4_4_ * fVar118;
  auVar87._8_4_ = auVar148._8_4_ * fVar197;
  auVar87._12_4_ = auVar148._12_4_ * fVar213;
  auVar5 = vfmadd231ps_fma(auVar199,auVar120,auVar5);
  auVar6 = vfmadd231ps_fma(auVar119,auVar120,auVar8);
  auVar8 = vfmadd231ps_fma(auVar87,auVar120,auVar88);
  auVar9 = vfmadd231ps_fma(auVar5,auVar276,auVar4);
  auVar88 = vfmadd231ps_fma(auVar6,auVar276,auVar7);
  auVar148 = vfmadd231ps_fma(auVar8,auVar276,auVar89);
  auVar236._8_4_ = 0x7fffffff;
  auVar236._0_8_ = 0x7fffffff7fffffff;
  auVar236._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar162,auVar236);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar186,1);
  auVar5 = vblendvps_avx(auVar162,auVar186,auVar4);
  auVar4 = vandps_avx(auVar143,auVar236);
  auVar4 = vcmpps_avx(auVar4,auVar186,1);
  auVar6 = vblendvps_avx(auVar143,auVar186,auVar4);
  auVar4 = vandps_avx(auVar236,auVar187);
  auVar4 = vcmpps_avx(auVar4,auVar186,1);
  auVar4 = vblendvps_avx(auVar187,auVar186,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar232._8_4_ = 0x3f800000;
  auVar232._0_8_ = 0x3f8000003f800000;
  auVar232._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar232);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar232);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar6 = vfnmadd213ps_fma(auVar4,auVar5,auVar232);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar89 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar187._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar187._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar187._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar187._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vsubps_avx(auVar4,auVar9);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar6);
  auVar200._0_4_ = auVar7._0_4_ * auVar5._0_4_;
  auVar200._4_4_ = auVar7._4_4_ * auVar5._4_4_;
  auVar200._8_4_ = auVar7._8_4_ * auVar5._8_4_;
  auVar200._12_4_ = auVar7._12_4_ * auVar5._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar88);
  auVar220._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar220._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar220._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar220._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar143._1_3_ = 0;
  auVar143[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar88);
  auVar120._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar120._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar120._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar120._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vsubps_avx(auVar4,auVar148);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar162._0_4_ = auVar89._0_4_ * auVar5._0_4_;
  auVar162._4_4_ = auVar89._4_4_ * auVar5._4_4_;
  auVar162._8_4_ = auVar89._8_4_ * auVar5._8_4_;
  auVar162._12_4_ = auVar89._12_4_ * auVar5._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar148);
  auVar88._0_4_ = auVar89._0_4_ * auVar4._0_4_;
  auVar88._4_4_ = auVar89._4_4_ * auVar4._4_4_;
  auVar88._8_4_ = auVar89._8_4_ * auVar4._8_4_;
  auVar88._12_4_ = auVar89._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar187,auVar200);
  auVar5 = vpminsd_avx(auVar220,auVar120);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar162,auVar88);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar244._4_4_ = uVar84;
  auVar244._0_4_ = uVar84;
  auVar244._8_4_ = uVar84;
  auVar244._12_4_ = uVar84;
  auVar5 = vmaxps_avx(auVar5,auVar244);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_7e0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_7e0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_7e0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_7e0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar187,auVar200);
  auVar5 = vpmaxsd_avx(auVar220,auVar120);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar162,auVar88);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar148._4_4_ = uVar84;
  auVar148._0_4_ = uVar84;
  auVar148._8_4_ = uVar84;
  auVar148._12_4_ = uVar84;
  auVar5 = vminps_avx(auVar5,auVar148);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar143[4] = PVar1;
  auVar143._5_3_ = 0;
  auVar143[8] = PVar1;
  auVar143._9_3_ = 0;
  auVar143[0xc] = PVar1;
  auVar143._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar143,_DAT_01f4ad30);
  auVar89._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar89._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar89._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar89._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar4 = vcmpps_avx(local_7e0,auVar89,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar84 = vmovmskps_avx(auVar4);
  local_988 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar84);
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_740 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  iVar75 = 1 << ((uint)k & 0x1f);
  auVar102._4_4_ = iVar75;
  auVar102._0_4_ = iVar75;
  auVar102._8_4_ = iVar75;
  auVar102._12_4_ = iVar75;
  auVar102._16_4_ = iVar75;
  auVar102._20_4_ = iVar75;
  auVar102._24_4_ = iVar75;
  auVar102._28_4_ = iVar75;
  auVar160 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar101 = vpand_avx2(auVar102,auVar160);
  local_7c0 = vpcmpeqd_avx2(auVar101,auVar160);
  auVar251 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_998 = prim;
LAB_01170495:
  if (local_988 == 0) {
LAB_01172d3f:
    return local_988 != 0;
  }
  lVar80 = 0;
  for (uVar78 = local_988; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  uVar77 = *(uint *)(local_998 + 2);
  local_7a0 = *(uint *)(local_998 + lVar80 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar77].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_7a0);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar80 + (long)p_Var3 * uVar78);
  auVar5 = *(undefined1 (*) [16])(lVar80 + (uVar78 + 1) * (long)p_Var3);
  local_990 = local_988 - 1 & local_988;
  if (local_990 != 0) {
    uVar83 = local_990 - 1 & local_990;
    for (uVar79 = local_990; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar7 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar259._4_4_ = uVar84;
  auVar259._0_4_ = uVar84;
  auVar259._8_4_ = uVar84;
  auVar259._12_4_ = uVar84;
  fStack_930 = (float)uVar84;
  _local_940 = auVar259;
  fStack_92c = (float)uVar84;
  fStack_928 = (float)uVar84;
  register0x000014dc = uVar84;
  uVar84 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar270._4_4_ = uVar84;
  auVar270._0_4_ = uVar84;
  auVar270._8_4_ = uVar84;
  auVar270._12_4_ = uVar84;
  fStack_870 = (float)uVar84;
  _local_880 = auVar270;
  fStack_86c = (float)uVar84;
  fStack_868 = (float)uVar84;
  register0x0000155c = uVar84;
  auVar6 = vunpcklps_avx(auVar259,auVar270);
  fVar86 = *(float *)(ray + k * 4 + 0xc0);
  auVar263._4_4_ = fVar86;
  auVar263._0_4_ = fVar86;
  auVar263._8_4_ = fVar86;
  auVar263._12_4_ = fVar86;
  fStack_950 = fVar86;
  _local_960 = auVar263;
  fStack_94c = fVar86;
  fStack_948 = fVar86;
  register0x0000151c = fVar86;
  auVar267 = ZEXT3264(_local_960);
  local_a30 = vinsertps_avx(auVar6,auVar263,0x28);
  auVar239 = ZEXT1664(local_a30);
  auVar201._0_4_ = (auVar4._0_4_ + auVar5._0_4_) * 0.5;
  auVar201._4_4_ = (auVar4._4_4_ + auVar5._4_4_) * 0.5;
  auVar201._8_4_ = (auVar4._8_4_ + auVar5._8_4_) * 0.5;
  auVar201._12_4_ = (auVar4._12_4_ + auVar5._12_4_) * 0.5;
  auVar6 = vsubps_avx(auVar201,auVar7);
  auVar6 = vdpps_avx(auVar6,local_a30,0x7f);
  local_a40 = vdpps_avx(local_a30,local_a30,0x7f);
  auVar258 = ZEXT1664(local_a40);
  auVar8 = vrcpss_avx(local_a40,local_a40);
  auVar9 = vfnmadd213ss_fma(auVar8,local_a40,ZEXT416(0x40000000));
  auVar234 = ZEXT1664(auVar9);
  local_360 = auVar6._0_4_ * auVar8._0_4_ * auVar9._0_4_;
  auVar221._4_4_ = local_360;
  auVar221._0_4_ = local_360;
  auVar221._8_4_ = local_360;
  auVar221._12_4_ = local_360;
  fStack_970 = local_360;
  _local_980 = auVar221;
  fStack_96c = local_360;
  fStack_968 = local_360;
  fStack_964 = local_360;
  auVar6 = vfmadd231ps_fma(auVar7,local_a30,auVar221);
  auVar6 = vblendps_avx(auVar6,_DAT_01f45a50,8);
  auVar7 = vsubps_avx(auVar4,auVar6);
  auVar8 = vsubps_avx(*(undefined1 (*) [16])(lVar80 + (uVar78 + 2) * (long)p_Var3),auVar6);
  auVar9 = vsubps_avx(auVar5,auVar6);
  auVar6 = vsubps_avx(*(undefined1 (*) [16])(lVar80 + (uVar78 + 3) * (long)p_Var3),auVar6);
  auVar4 = vmovshdup_avx(auVar7);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vmovshdup_avx(auVar9);
  local_5c0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  local_5e0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  local_600 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar8);
  local_620 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  local_640 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  local_660 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar6);
  local_680 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xaa);
  local_6a0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xff);
  local_6c0 = auVar4._0_8_;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar86 * fVar86)),_local_880,_local_880);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_940,_local_940);
  uVar84 = auVar4._0_4_;
  local_240._4_4_ = uVar84;
  local_240._0_4_ = uVar84;
  local_240._8_4_ = uVar84;
  local_240._12_4_ = uVar84;
  local_240._16_4_ = uVar84;
  local_240._20_4_ = uVar84;
  local_240._24_4_ = uVar84;
  local_240._28_4_ = uVar84;
  fVar86 = *(float *)(ray + k * 4 + 0x60);
  local_9b0 = ZEXT416((uint)local_360);
  local_360 = fVar86 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar78 = 0;
  bVar82 = 0;
  local_ce4 = 1;
  local_260 = auVar7._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_6e0 = auVar9._0_4_;
  local_700 = auVar8._0_4_;
  fVar118 = auVar6._0_4_;
  local_8a0._8_4_ = 0x7fffffff;
  local_8a0._0_8_ = 0x7fffffff7fffffff;
  local_8a0._12_4_ = 0x7fffffff;
  local_8a0._16_4_ = 0x7fffffff;
  local_8a0._20_4_ = 0x7fffffff;
  local_8a0._24_4_ = 0x7fffffff;
  local_8a0._28_4_ = 0x7fffffff;
  local_760 = vandps_avx(local_240,local_8a0);
  auVar4 = vsqrtss_avx(local_a40,local_a40);
  auVar5 = vsqrtss_avx(local_a40,local_a40);
  auVar142 = ZEXT1664(ZEXT816(0x3f80000000000000));
  uStack_79c = local_7a0;
  uStack_798 = local_7a0;
  uStack_794 = local_7a0;
  uStack_790 = local_7a0;
  uStack_78c = local_7a0;
  uStack_788 = local_7a0;
  uStack_784 = local_7a0;
  local_780 = uVar77;
  uStack_77c = uVar77;
  uStack_778 = uVar77;
  uStack_774 = uVar77;
  uStack_770 = uVar77;
  uStack_76c = uVar77;
  uStack_768 = uVar77;
  uStack_764 = uVar77;
  local_720 = fVar118;
  fStack_71c = fVar118;
  fStack_718 = fVar118;
  fStack_714 = fVar118;
  fStack_710 = fVar118;
  fStack_70c = fVar118;
  fStack_708 = fVar118;
  fStack_704 = fVar118;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  uStack_6f0 = local_700;
  uStack_6ec = local_700;
  uStack_6e8 = local_700;
  uStack_6e4 = local_700;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6d0 = local_6e0;
  uStack_6cc = local_6e0;
  uStack_6c8 = local_6e0;
  uStack_6c4 = local_6e0;
  uStack_6b8 = local_6c0;
  uStack_6b0 = local_6c0;
  uStack_6a8 = local_6c0;
  uStack_698 = local_6a0;
  uStack_690 = local_6a0;
  uStack_688 = local_6a0;
  uStack_678 = local_680;
  uStack_670 = local_680;
  uStack_668 = local_680;
  uStack_658 = local_660;
  uStack_650 = local_660;
  uStack_648 = local_660;
  uStack_638 = local_640;
  uStack_630 = local_640;
  uStack_628 = local_640;
  uStack_618 = local_620;
  uStack_610 = local_620;
  uStack_608 = local_620;
  uStack_5f8 = local_600;
  uStack_5f0 = local_600;
  uStack_5e8 = local_600;
  uStack_5d8 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  do {
    local_7d0 = auVar142._0_16_;
    auVar89 = vmovshdup_avx(local_7d0);
    auVar89 = vsubps_avx(auVar89,local_7d0);
    auVar103._0_4_ = auVar89._0_4_;
    fVar185 = auVar103._0_4_ * 0.04761905;
    uVar84 = auVar142._0_4_;
    local_8e0._4_4_ = uVar84;
    local_8e0._0_4_ = uVar84;
    local_8e0._8_4_ = uVar84;
    local_8e0._12_4_ = uVar84;
    local_8e0._16_4_ = uVar84;
    local_8e0._20_4_ = uVar84;
    local_8e0._24_4_ = uVar84;
    local_8e0._28_4_ = uVar84;
    auVar103._4_4_ = auVar103._0_4_;
    auVar103._8_4_ = auVar103._0_4_;
    auVar103._12_4_ = auVar103._0_4_;
    auVar103._16_4_ = auVar103._0_4_;
    auVar103._20_4_ = auVar103._0_4_;
    auVar103._24_4_ = auVar103._0_4_;
    auVar103._28_4_ = auVar103._0_4_;
    auVar89 = vfmadd231ps_fma(local_8e0,auVar103,_DAT_01f7b040);
    auVar101 = vsubps_avx(auVar251._0_32_,ZEXT1632(auVar89));
    fVar197 = auVar89._0_4_;
    fVar214 = auVar89._4_4_;
    fVar216 = auVar89._8_4_;
    fVar218 = auVar89._12_4_;
    auVar288._28_36_ = auVar287._28_36_;
    auVar288._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * fVar218,
                            CONCAT48(fVar216 * fVar216,CONCAT44(fVar214 * fVar214,fVar197 * fVar197)
                                    )));
    fVar235 = fVar197 * 3.0;
    fVar240 = fVar214 * 3.0;
    fVar241 = fVar216 * 3.0;
    fVar242 = fVar218 * 3.0;
    fVar213 = auVar101._0_4_;
    auVar251._0_4_ = fVar213 * fVar213;
    fVar215 = auVar101._4_4_;
    auVar251._4_4_ = fVar215 * fVar215;
    fVar217 = auVar101._8_4_;
    auVar251._8_4_ = fVar217 * fVar217;
    fVar181 = auVar101._12_4_;
    auVar251._12_4_ = fVar181 * fVar181;
    fVar182 = auVar101._16_4_;
    auVar251._16_4_ = fVar182 * fVar182;
    fVar183 = auVar101._20_4_;
    auVar251._20_4_ = fVar183 * fVar183;
    fVar184 = auVar101._24_4_;
    auVar251._28_36_ = auVar258._28_36_;
    auVar251._24_4_ = fVar184 * fVar184;
    auVar287._0_4_ = (auVar251._0_4_ * (fVar213 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar287._4_4_ = (auVar251._4_4_ * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar287._8_4_ = (auVar251._8_4_ * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar287._12_4_ = (auVar251._12_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar287._16_4_ = (auVar251._16_4_ * (fVar182 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar287._20_4_ = (auVar251._20_4_ * (fVar183 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar287._28_36_ = auVar267._28_36_;
    auVar287._24_4_ = (auVar251._24_4_ * (fVar184 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar102 = auVar287._0_32_;
    fVar219 = fVar197 * fVar197 * -fVar213 * 0.5;
    fVar225 = fVar214 * fVar214 * -fVar215 * 0.5;
    fVar226 = fVar216 * fVar216 * -fVar217 * 0.5;
    fVar227 = fVar218 * fVar218 * -fVar181 * 0.5;
    fVar228 = -fVar182 * 0.0 * 0.0 * 0.5;
    fVar229 = -fVar183 * 0.0 * 0.0 * 0.5;
    fVar230 = -fVar184 * 0.0 * 0.0 * 0.5;
    auVar160._4_4_ = fVar225 * fStack_71c;
    auVar160._0_4_ = fVar219 * local_720;
    auVar160._8_4_ = fVar226 * fStack_718;
    auVar160._12_4_ = fVar227 * fStack_714;
    auVar160._16_4_ = fVar228 * fStack_710;
    auVar160._20_4_ = fVar229 * fStack_70c;
    auVar160._24_4_ = fVar230 * fStack_708;
    auVar160._28_4_ = auVar101._28_4_ ^ 0x80000000;
    auVar142._0_4_ = fVar219 * (float)local_680;
    auVar142._4_4_ = fVar225 * local_680._4_4_;
    auVar142._8_4_ = fVar226 * (float)uStack_678;
    auVar142._12_4_ = fVar227 * uStack_678._4_4_;
    auVar142._16_4_ = fVar228 * (float)uStack_670;
    auVar142._20_4_ = fVar229 * uStack_670._4_4_;
    auVar142._28_36_ = auVar281._28_36_;
    auVar142._24_4_ = fVar230 * (float)uStack_668;
    auVar157._0_4_ = fVar219 * (float)local_6a0;
    auVar157._4_4_ = fVar225 * local_6a0._4_4_;
    auVar157._8_4_ = fVar226 * (float)uStack_698;
    auVar157._12_4_ = fVar227 * uStack_698._4_4_;
    auVar157._16_4_ = fVar228 * (float)uStack_690;
    auVar157._20_4_ = fVar229 * uStack_690._4_4_;
    auVar157._24_4_ = fVar230 * (float)uStack_688;
    auVar157._28_4_ = 0;
    auVar280._4_4_ = fVar225 * local_6c0._4_4_;
    auVar280._0_4_ = fVar219 * (float)local_6c0;
    auVar280._8_4_ = fVar226 * (float)uStack_6b8;
    auVar280._12_4_ = fVar227 * uStack_6b8._4_4_;
    auVar280._16_4_ = fVar228 * (float)uStack_6b0;
    auVar280._20_4_ = fVar229 * uStack_6b0._4_4_;
    auVar280._24_4_ = fVar230 * (float)uStack_6a8;
    auVar280._28_4_ = auVar234._28_4_ + -5.0 + 2.0;
    auVar104._4_4_ = uStack_6fc;
    auVar104._0_4_ = local_700;
    auVar104._8_4_ = uStack_6f8;
    auVar104._12_4_ = uStack_6f4;
    auVar104._16_4_ = uStack_6f0;
    auVar104._20_4_ = uStack_6ec;
    auVar104._24_4_ = uStack_6e8;
    auVar104._28_4_ = uStack_6e4;
    auVar89 = vfmadd231ps_fma(auVar160,auVar102,auVar104);
    auVar59._8_8_ = uStack_618;
    auVar59._0_8_ = local_620;
    auVar59._16_8_ = uStack_610;
    auVar59._24_8_ = uStack_608;
    auVar88 = vfmadd231ps_fma(auVar142._0_32_,auVar102,auVar59);
    auVar57._8_8_ = uStack_638;
    auVar57._0_8_ = local_640;
    auVar57._16_8_ = uStack_630;
    auVar57._24_8_ = uStack_628;
    auVar148 = vfmadd231ps_fma(auVar157,auVar102,auVar57);
    auVar55._8_8_ = uStack_658;
    auVar55._0_8_ = local_660;
    auVar55._16_8_ = uStack_650;
    auVar55._24_8_ = uStack_648;
    auVar120 = vfmadd231ps_fma(auVar280,auVar102,auVar55);
    auVar11._4_4_ = (fVar214 * fVar214 * (fVar240 + -5.0) + 2.0) * 0.5;
    auVar11._0_4_ = (fVar197 * fVar197 * (fVar235 + -5.0) + 2.0) * 0.5;
    auVar11._8_4_ = (fVar216 * fVar216 * (fVar241 + -5.0) + 2.0) * 0.5;
    auVar11._12_4_ = (fVar218 * fVar218 * (fVar242 + -5.0) + 2.0) * 0.5;
    auVar11._16_4_ = 0x3f800000;
    auVar11._20_4_ = 0x3f800000;
    auVar11._24_4_ = 0x3f800000;
    auVar11._28_4_ = auVar267._28_4_ + 2.0;
    auVar53._4_4_ = uStack_6dc;
    auVar53._0_4_ = local_6e0;
    auVar53._8_4_ = uStack_6d8;
    auVar53._12_4_ = uStack_6d4;
    auVar53._16_4_ = uStack_6d0;
    auVar53._20_4_ = uStack_6cc;
    auVar53._24_4_ = uStack_6c8;
    auVar53._28_4_ = uStack_6c4;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar11,auVar53);
    auVar65._8_8_ = uStack_5b8;
    auVar65._0_8_ = local_5c0;
    auVar65._16_8_ = uStack_5b0;
    auVar65._24_8_ = uStack_5a8;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar11,auVar65);
    auVar63._8_8_ = uStack_5d8;
    auVar63._0_8_ = local_5e0;
    auVar63._16_8_ = uStack_5d0;
    auVar63._24_8_ = uStack_5c8;
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar11,auVar63);
    auVar61._8_8_ = uStack_5f8;
    auVar61._0_8_ = local_600;
    auVar61._16_8_ = uStack_5f0;
    auVar61._24_8_ = uStack_5e8;
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar11,auVar61);
    local_920._8_4_ = 0x80000000;
    local_920._0_8_ = 0x8000000080000000;
    local_920._12_4_ = 0x80000000;
    uStack_910 = 0x80000000;
    uStack_90c = 0x80000000;
    uStack_908 = 0x80000000;
    uStack_904 = 0x80000000;
    auVar210._4_4_ = -fVar214 * fVar215 * fVar215 * 0.5;
    auVar210._0_4_ = -fVar197 * fVar213 * fVar213 * 0.5;
    auVar210._8_4_ = -fVar216 * fVar217 * fVar217 * 0.5;
    auVar210._12_4_ = -fVar218 * fVar181 * fVar181 * 0.5;
    auVar210._16_4_ = fVar182 * -0.0 * fVar182 * 0.5;
    auVar210._20_4_ = fVar183 * -0.0 * fVar183 * 0.5;
    auVar210._24_4_ = fVar184 * -0.0 * fVar184 * 0.5;
    auVar210._28_4_ = 0x80000000;
    auVar70._4_4_ = uStack_25c;
    auVar70._0_4_ = local_260;
    auVar70._8_4_ = uStack_258;
    auVar70._12_4_ = uStack_254;
    auVar70._16_4_ = uStack_250;
    auVar70._20_4_ = uStack_24c;
    auVar70._24_4_ = uStack_248;
    auVar70._28_4_ = uStack_244;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar210,auVar70);
    auVar73._8_8_ = uStack_1d8;
    auVar73._0_8_ = local_1e0;
    auVar73._16_8_ = uStack_1d0;
    auVar73._24_8_ = uStack_1c8;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar210,auVar73);
    auVar72._8_8_ = uStack_1f8;
    auVar72._0_8_ = local_200;
    auVar72._16_8_ = uStack_1f0;
    auVar72._24_8_ = uStack_1e8;
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar210,auVar72);
    auVar71._8_8_ = uStack_218;
    auVar71._0_8_ = local_220;
    auVar71._16_8_ = uStack_210;
    auVar71._24_8_ = uStack_208;
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar71,auVar210);
    auVar104 = ZEXT1632(auVar120);
    auVar204._0_4_ = (fVar213 + fVar213) * fVar197;
    auVar204._4_4_ = (fVar215 + fVar215) * fVar214;
    auVar204._8_4_ = (fVar217 + fVar217) * fVar216;
    auVar204._12_4_ = (fVar181 + fVar181) * fVar218;
    auVar204._16_4_ = (fVar182 + fVar182) * 0.0;
    auVar204._20_4_ = (fVar183 + fVar183) * 0.0;
    auVar204._24_4_ = (fVar184 + fVar184) * 0.0;
    auVar204._28_4_ = 0;
    auVar160 = vsubps_avx(auVar204,auVar251._0_32_);
    fVar219 = auVar239._28_4_ + 2.0;
    auVar111._4_4_ = (fVar215 + fVar215) * (fVar240 + 2.0);
    auVar111._0_4_ = (fVar213 + fVar213) * (fVar235 + 2.0);
    auVar111._8_4_ = (fVar217 + fVar217) * (fVar241 + 2.0);
    auVar111._12_4_ = (fVar181 + fVar181) * (fVar242 + 2.0);
    auVar111._16_4_ = (fVar182 + fVar182) * 2.0;
    auVar111._20_4_ = (fVar183 + fVar183) * 2.0;
    auVar111._24_4_ = (fVar184 + fVar184) * 2.0;
    auVar111._28_4_ = fVar219;
    auVar131._4_4_ = fVar215 * fVar215 * 3.0;
    auVar131._0_4_ = fVar213 * fVar213 * 3.0;
    auVar131._8_4_ = fVar217 * fVar217 * 3.0;
    auVar131._12_4_ = fVar181 * fVar181 * 3.0;
    auVar131._16_4_ = fVar182 * fVar182 * 3.0;
    auVar131._20_4_ = fVar183 * fVar183 * 3.0;
    auVar131._24_4_ = fVar184 * fVar184 * 3.0;
    auVar131._28_4_ = auVar101._28_4_;
    auVar101 = vsubps_avx(auVar111,auVar131);
    auVar102 = vsubps_avx(auVar288._0_32_,auVar204);
    auVar209._4_4_ = auVar160._4_4_ * 0.5;
    auVar209._0_4_ = auVar160._0_4_ * 0.5;
    auVar209._8_4_ = auVar160._8_4_ * 0.5;
    auVar209._12_4_ = auVar160._12_4_ * 0.5;
    auVar209._16_4_ = auVar160._16_4_ * 0.5;
    auVar209._20_4_ = auVar160._20_4_ * 0.5;
    auVar209._24_4_ = auVar160._24_4_ * 0.5;
    auVar209._28_4_ = auVar234._28_4_;
    auVar13._28_4_ = fVar219;
    auVar13._0_28_ =
         ZEXT1628(CONCAT412((fVar242 * fVar218 + (fVar218 + fVar218) * (fVar242 + -5.0)) * 0.5,
                            CONCAT48((fVar241 * fVar216 + (fVar216 + fVar216) * (fVar241 + -5.0)) *
                                     0.5,CONCAT44((fVar240 * fVar214 +
                                                  (fVar214 + fVar214) * (fVar240 + -5.0)) * 0.5,
                                                  (fVar235 * fVar197 +
                                                  (fVar197 + fVar197) * (fVar235 + -5.0)) * 0.5))));
    auVar14._4_4_ = auVar101._4_4_ * 0.5;
    auVar14._0_4_ = auVar101._0_4_ * 0.5;
    auVar14._8_4_ = auVar101._8_4_ * 0.5;
    auVar14._12_4_ = auVar101._12_4_ * 0.5;
    auVar14._16_4_ = auVar101._16_4_ * 0.5;
    auVar14._20_4_ = auVar101._20_4_ * 0.5;
    auVar14._24_4_ = auVar101._24_4_ * 0.5;
    auVar14._28_4_ = auVar101._28_4_;
    fVar197 = auVar102._0_4_ * 0.5;
    fVar213 = auVar102._4_4_ * 0.5;
    fVar214 = auVar102._8_4_ * 0.5;
    fVar215 = auVar102._12_4_ * 0.5;
    fVar216 = auVar102._16_4_ * 0.5;
    fVar217 = auVar102._20_4_ * 0.5;
    fVar218 = auVar102._24_4_ * 0.5;
    auVar15._4_4_ = fVar213 * fStack_71c;
    auVar15._0_4_ = fVar197 * local_720;
    auVar15._8_4_ = fVar214 * fStack_718;
    auVar15._12_4_ = fVar215 * fStack_714;
    auVar15._16_4_ = fVar216 * fStack_710;
    auVar15._20_4_ = fVar217 * fStack_70c;
    auVar15._24_4_ = fVar218 * fStack_708;
    auVar15._28_4_ = 0x3f000000;
    auVar16._4_4_ = fVar213 * local_680._4_4_;
    auVar16._0_4_ = fVar197 * (float)local_680;
    auVar16._8_4_ = fVar214 * (float)uStack_678;
    auVar16._12_4_ = fVar215 * uStack_678._4_4_;
    auVar16._16_4_ = fVar216 * (float)uStack_670;
    auVar16._20_4_ = fVar217 * uStack_670._4_4_;
    auVar16._24_4_ = fVar218 * (float)uStack_668;
    auVar16._28_4_ = auVar160._28_4_;
    auVar17._4_4_ = fVar213 * local_6a0._4_4_;
    auVar17._0_4_ = fVar197 * (float)local_6a0;
    auVar17._8_4_ = fVar214 * (float)uStack_698;
    auVar17._12_4_ = fVar215 * uStack_698._4_4_;
    auVar17._16_4_ = fVar216 * (float)uStack_690;
    auVar17._20_4_ = fVar217 * uStack_690._4_4_;
    auVar17._24_4_ = fVar218 * (float)uStack_688;
    auVar17._28_4_ = auVar239._28_4_ + -5.0 + 0.0;
    auVar129._4_4_ = fVar213 * local_6c0._4_4_;
    auVar129._0_4_ = fVar197 * (float)local_6c0;
    auVar129._8_4_ = fVar214 * (float)uStack_6b8;
    auVar129._12_4_ = fVar215 * uStack_6b8._4_4_;
    auVar129._16_4_ = fVar216 * (float)uStack_6b0;
    auVar129._20_4_ = fVar217 * uStack_6b0._4_4_;
    auVar129._24_4_ = fVar218 * (float)uStack_6a8;
    auVar129._28_4_ = auVar102._28_4_;
    auVar52._4_4_ = uStack_6fc;
    auVar52._0_4_ = local_700;
    auVar52._8_4_ = uStack_6f8;
    auVar52._12_4_ = uStack_6f4;
    auVar52._16_4_ = uStack_6f0;
    auVar52._20_4_ = uStack_6ec;
    auVar52._24_4_ = uStack_6e8;
    auVar52._28_4_ = uStack_6e4;
    auVar87 = vfmadd231ps_fma(auVar15,auVar14,auVar52);
    auVar60._8_8_ = uStack_618;
    auVar60._0_8_ = local_620;
    auVar60._16_8_ = uStack_610;
    auVar60._24_8_ = uStack_608;
    auVar143 = vfmadd231ps_fma(auVar16,auVar14,auVar60);
    auVar58._8_8_ = uStack_638;
    auVar58._0_8_ = local_640;
    auVar58._16_8_ = uStack_630;
    auVar58._24_8_ = uStack_628;
    auVar162 = vfmadd231ps_fma(auVar17,auVar14,auVar58);
    auVar56._8_8_ = uStack_658;
    auVar56._0_8_ = local_660;
    auVar56._16_8_ = uStack_650;
    auVar56._24_8_ = uStack_648;
    auVar187 = vfmadd231ps_fma(auVar129,auVar14,auVar56);
    auVar54._4_4_ = uStack_6dc;
    auVar54._0_4_ = local_6e0;
    auVar54._8_4_ = uStack_6d8;
    auVar54._12_4_ = uStack_6d4;
    auVar54._16_4_ = uStack_6d0;
    auVar54._20_4_ = uStack_6cc;
    auVar54._24_4_ = uStack_6c8;
    auVar54._28_4_ = uStack_6c4;
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar13,auVar54);
    auVar66._8_8_ = uStack_5b8;
    auVar66._0_8_ = local_5c0;
    auVar66._16_8_ = uStack_5b0;
    auVar66._24_8_ = uStack_5a8;
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar13,auVar66);
    auVar64._8_8_ = uStack_5d8;
    auVar64._0_8_ = local_5e0;
    auVar64._16_8_ = uStack_5d0;
    auVar64._24_8_ = uStack_5c8;
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar13,auVar64);
    auVar62._8_8_ = uStack_5f8;
    auVar62._0_8_ = local_600;
    auVar62._16_8_ = uStack_5f0;
    auVar62._24_8_ = uStack_5e8;
    auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar13,auVar62);
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar209,auVar70);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar209,auVar73);
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar209,auVar72);
    auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar71,auVar209);
    local_8c0._0_4_ = auVar87._0_4_ * fVar185;
    local_8c0._4_4_ = auVar87._4_4_ * fVar185;
    local_8c0._8_4_ = auVar87._8_4_ * fVar185;
    local_8c0._12_4_ = auVar87._12_4_ * fVar185;
    local_8c0._16_4_ = fVar185 * 0.0;
    local_8c0._20_4_ = fVar185 * 0.0;
    local_8c0._24_4_ = fVar185 * 0.0;
    local_8c0._28_4_ = 0;
    auVar255._0_4_ = auVar143._0_4_ * fVar185;
    auVar255._4_4_ = auVar143._4_4_ * fVar185;
    auVar255._8_4_ = auVar143._8_4_ * fVar185;
    auVar255._12_4_ = auVar143._12_4_ * fVar185;
    auVar255._16_4_ = fVar185 * 0.0;
    auVar255._20_4_ = fVar185 * 0.0;
    auVar255._24_4_ = fVar185 * 0.0;
    auVar255._28_4_ = 0;
    auVar260._0_4_ = auVar162._0_4_ * fVar185;
    auVar260._4_4_ = auVar162._4_4_ * fVar185;
    auVar260._8_4_ = auVar162._8_4_ * fVar185;
    auVar260._12_4_ = auVar162._12_4_ * fVar185;
    auVar260._16_4_ = fVar185 * 0.0;
    auVar260._20_4_ = fVar185 * 0.0;
    auVar260._24_4_ = fVar185 * 0.0;
    auVar260._28_4_ = 0;
    fVar197 = fVar185 * auVar187._0_4_;
    fVar213 = fVar185 * auVar187._4_4_;
    auVar208._4_4_ = fVar213;
    auVar208._0_4_ = fVar197;
    fVar214 = fVar185 * auVar187._8_4_;
    auVar208._8_4_ = fVar214;
    fVar215 = fVar185 * auVar187._12_4_;
    auVar208._12_4_ = fVar215;
    auVar208._16_4_ = fVar185 * 0.0;
    auVar208._20_4_ = fVar185 * 0.0;
    auVar208._24_4_ = fVar185 * 0.0;
    auVar208._28_4_ = fVar185;
    auVar129 = ZEXT1632(auVar89);
    auVar209 = vpermps_avx2(_DAT_01fb7720,auVar129);
    auVar13 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar148));
    local_2e0 = vsubps_avx(auVar209,ZEXT1632(auVar89));
    local_2c0 = vsubps_avx(auVar13,ZEXT1632(auVar148));
    fVar181 = local_2c0._0_4_;
    fVar182 = local_2c0._4_4_;
    auVar265._4_4_ = fVar182 * local_8c0._4_4_;
    auVar265._0_4_ = fVar181 * (float)local_8c0._0_4_;
    fVar183 = local_2c0._8_4_;
    auVar265._8_4_ = fVar183 * local_8c0._8_4_;
    fVar184 = local_2c0._12_4_;
    auVar265._12_4_ = fVar184 * local_8c0._12_4_;
    fVar219 = local_2c0._16_4_;
    auVar265._16_4_ = fVar219 * local_8c0._16_4_;
    fVar225 = local_2c0._20_4_;
    auVar265._20_4_ = fVar225 * local_8c0._20_4_;
    fVar241 = local_2c0._24_4_;
    auVar265._24_4_ = fVar241 * local_8c0._24_4_;
    auVar265._28_4_ = auVar13._28_4_;
    auVar89 = vfmsub231ps_fma(auVar265,auVar260,local_2e0);
    local_a00 = ZEXT1632(auVar88);
    auVar14 = vpermps_avx2(_DAT_01fb7720,local_a00);
    local_300 = vsubps_avx(auVar14,ZEXT1632(auVar88));
    fVar242 = local_2e0._0_4_;
    fVar268 = local_2e0._4_4_;
    auVar277._4_4_ = fVar268 * auVar255._4_4_;
    auVar277._0_4_ = fVar242 * auVar255._0_4_;
    fVar269 = local_2e0._8_4_;
    auVar277._8_4_ = fVar269 * auVar255._8_4_;
    fVar271 = local_2e0._12_4_;
    auVar277._12_4_ = fVar271 * auVar255._12_4_;
    fVar272 = local_2e0._16_4_;
    auVar277._16_4_ = fVar272 * auVar255._16_4_;
    fVar273 = local_2e0._20_4_;
    auVar277._20_4_ = fVar273 * auVar255._20_4_;
    fVar274 = local_2e0._24_4_;
    auVar277._24_4_ = fVar274 * auVar255._24_4_;
    auVar277._28_4_ = auVar14._28_4_;
    auVar88 = vfmsub231ps_fma(auVar277,local_8c0,local_300);
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar88._12_4_ * auVar88._12_4_,
                                                 CONCAT48(auVar88._8_4_ * auVar88._8_4_,
                                                          CONCAT44(auVar88._4_4_ * auVar88._4_4_,
                                                                   auVar88._0_4_ * auVar88._0_4_))))
                              ,ZEXT1632(auVar89),ZEXT1632(auVar89));
    fVar226 = local_300._0_4_;
    auVar205._0_4_ = fVar226 * auVar260._0_4_;
    fVar227 = local_300._4_4_;
    auVar205._4_4_ = fVar227 * auVar260._4_4_;
    fVar228 = local_300._8_4_;
    auVar205._8_4_ = fVar228 * auVar260._8_4_;
    fVar229 = local_300._12_4_;
    auVar205._12_4_ = fVar229 * auVar260._12_4_;
    fVar230 = local_300._16_4_;
    auVar205._16_4_ = fVar230 * auVar260._16_4_;
    fVar235 = local_300._20_4_;
    auVar205._20_4_ = fVar235 * auVar260._20_4_;
    fVar240 = local_300._24_4_;
    auVar205._24_4_ = fVar240 * auVar260._24_4_;
    auVar205._28_4_ = 0;
    auVar88 = vfmsub231ps_fma(auVar205,auVar255,local_2c0);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar88),ZEXT1632(auVar88));
    auVar206._0_4_ = fVar181 * fVar181;
    auVar206._4_4_ = fVar182 * fVar182;
    auVar206._8_4_ = fVar183 * fVar183;
    auVar206._12_4_ = fVar184 * fVar184;
    auVar206._16_4_ = fVar219 * fVar219;
    auVar206._20_4_ = fVar225 * fVar225;
    auVar206._24_4_ = fVar241 * fVar241;
    auVar206._28_4_ = 0;
    auVar89 = vfmadd231ps_fma(auVar206,local_300,local_300);
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar89),local_2e0,local_2e0);
    auVar101 = vrcpps_avx(ZEXT1632(auVar87));
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = 0x3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar89 = vfnmadd213ps_fma(auVar101,ZEXT1632(auVar87),auVar130);
    auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar101,auVar101);
    auVar15 = vpermps_avx2(_DAT_01fb7720,local_8c0);
    local_a60 = vpermps_avx2(_DAT_01fb7720,auVar260);
    auVar10._4_4_ = fVar182 * auVar15._4_4_;
    auVar10._0_4_ = fVar181 * auVar15._0_4_;
    auVar10._8_4_ = fVar183 * auVar15._8_4_;
    auVar10._12_4_ = fVar184 * auVar15._12_4_;
    auVar10._16_4_ = fVar219 * auVar15._16_4_;
    auVar10._20_4_ = fVar225 * auVar15._20_4_;
    auVar10._24_4_ = fVar241 * auVar15._24_4_;
    auVar10._28_4_ = auVar101._28_4_;
    auVar143 = vfmsub231ps_fma(auVar10,local_a60,local_2e0);
    local_a80 = vpermps_avx2(_DAT_01fb7720,auVar255);
    auVar12._4_4_ = fVar268 * local_a80._4_4_;
    auVar12._0_4_ = fVar242 * local_a80._0_4_;
    auVar12._8_4_ = fVar269 * local_a80._8_4_;
    auVar12._12_4_ = fVar271 * local_a80._12_4_;
    auVar12._16_4_ = fVar272 * local_a80._16_4_;
    auVar12._20_4_ = fVar273 * local_a80._20_4_;
    auVar12._24_4_ = fVar274 * local_a80._24_4_;
    auVar12._28_4_ = 0;
    auVar162 = vfmsub231ps_fma(auVar12,auVar15,local_300);
    auVar143 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar162._12_4_ * auVar162._12_4_,
                                                  CONCAT48(auVar162._8_4_ * auVar162._8_4_,
                                                           CONCAT44(auVar162._4_4_ * auVar162._4_4_,
                                                                    auVar162._0_4_ * auVar162._0_4_)
                                                          ))),ZEXT1632(auVar143),ZEXT1632(auVar143))
    ;
    auVar233._0_4_ = fVar226 * local_a60._0_4_;
    auVar233._4_4_ = fVar227 * local_a60._4_4_;
    auVar233._8_4_ = fVar228 * local_a60._8_4_;
    auVar233._12_4_ = fVar229 * local_a60._12_4_;
    auVar233._16_4_ = fVar230 * local_a60._16_4_;
    auVar233._20_4_ = fVar235 * local_a60._20_4_;
    auVar233._24_4_ = fVar240 * local_a60._24_4_;
    auVar233._28_4_ = 0;
    auVar162 = vfmsub231ps_fma(auVar233,local_a80,local_2c0);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),ZEXT1632(auVar162),ZEXT1632(auVar162));
    auVar101 = vmaxps_avx(ZEXT1632(CONCAT412(auVar89._12_4_ * auVar88._12_4_,
                                             CONCAT48(auVar89._8_4_ * auVar88._8_4_,
                                                      CONCAT44(auVar89._4_4_ * auVar88._4_4_,
                                                               auVar89._0_4_ * auVar88._0_4_)))),
                          ZEXT1632(CONCAT412(auVar143._12_4_ * auVar89._12_4_,
                                             CONCAT48(auVar143._8_4_ * auVar89._8_4_,
                                                      CONCAT44(auVar143._4_4_ * auVar89._4_4_,
                                                               auVar143._0_4_ * auVar89._0_4_)))));
    auVar194._0_4_ = auVar120._0_4_ + fVar197;
    auVar194._4_4_ = auVar120._4_4_ + fVar213;
    auVar194._8_4_ = auVar120._8_4_ + fVar214;
    auVar194._12_4_ = auVar120._12_4_ + fVar215;
    auVar194._16_4_ = fVar185 * 0.0 + 0.0;
    auVar194._20_4_ = fVar185 * 0.0 + 0.0;
    auVar194._24_4_ = fVar185 * 0.0 + 0.0;
    auVar194._28_4_ = fVar185 + 0.0;
    auVar160 = vsubps_avx(auVar104,auVar208);
    auVar16 = vpermps_avx2(_DAT_01fb7720,auVar160);
    auVar17 = vpermps_avx2(_DAT_01fb7720,auVar104);
    auVar160 = vmaxps_avx(auVar104,auVar194);
    auVar102 = vmaxps_avx(auVar16,auVar17);
    auVar160 = vmaxps_avx(auVar160,auVar102);
    auVar102 = vrsqrtps_avx(ZEXT1632(auVar87));
    fVar197 = auVar102._0_4_;
    fVar213 = auVar102._4_4_;
    fVar214 = auVar102._8_4_;
    fVar215 = auVar102._12_4_;
    fVar216 = auVar102._16_4_;
    fVar217 = auVar102._20_4_;
    fVar218 = auVar102._24_4_;
    auVar18._4_4_ = fVar213 * fVar213 * fVar213 * auVar87._4_4_ * -0.5;
    auVar18._0_4_ = fVar197 * fVar197 * fVar197 * auVar87._0_4_ * -0.5;
    auVar18._8_4_ = fVar214 * fVar214 * fVar214 * auVar87._8_4_ * -0.5;
    auVar18._12_4_ = fVar215 * fVar215 * fVar215 * auVar87._12_4_ * -0.5;
    auVar18._16_4_ = fVar216 * fVar216 * fVar216 * -0.0;
    auVar18._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
    auVar18._24_4_ = fVar218 * fVar218 * fVar218 * -0.0;
    auVar18._28_4_ = local_a60._28_4_;
    auVar207._8_4_ = 0x3fc00000;
    auVar207._0_8_ = 0x3fc000003fc00000;
    auVar207._12_4_ = 0x3fc00000;
    auVar207._16_4_ = 0x3fc00000;
    auVar207._20_4_ = 0x3fc00000;
    auVar207._24_4_ = 0x3fc00000;
    auVar207._28_4_ = 0x3fc00000;
    auVar89 = vfmadd231ps_fma(auVar18,auVar207,auVar102);
    fVar213 = auVar89._0_4_;
    fVar214 = auVar89._4_4_;
    auVar19._4_4_ = fVar227 * fVar214;
    auVar19._0_4_ = fVar226 * fVar213;
    fVar216 = auVar89._8_4_;
    auVar19._8_4_ = fVar228 * fVar216;
    fVar218 = auVar89._12_4_;
    auVar19._12_4_ = fVar229 * fVar218;
    auVar19._16_4_ = fVar230 * 0.0;
    auVar19._20_4_ = fVar235 * 0.0;
    uVar84 = auVar102._28_4_;
    auVar19._24_4_ = fVar240 * 0.0;
    auVar19._28_4_ = uVar84;
    auVar20._4_4_ = (float)local_960._4_4_ * fVar182 * fVar214;
    auVar20._0_4_ = (float)local_960._0_4_ * fVar181 * fVar213;
    auVar20._8_4_ = fStack_958 * fVar183 * fVar216;
    auVar20._12_4_ = fStack_954 * fVar184 * fVar218;
    auVar20._16_4_ = fStack_950 * fVar219 * 0.0;
    auVar20._20_4_ = fStack_94c * fVar225 * 0.0;
    auVar20._24_4_ = fStack_948 * fVar241 * 0.0;
    auVar20._28_4_ = local_2c0._28_4_;
    auVar89 = vfmadd231ps_fma(auVar20,auVar19,_local_880);
    local_2a0 = ZEXT1632(auVar148);
    auVar280 = vsubps_avx(ZEXT832(0) << 0x20,local_2a0);
    auVar239 = ZEXT3264(auVar280);
    fVar226 = auVar280._0_4_;
    fVar227 = auVar280._4_4_;
    auVar21._4_4_ = fVar227 * fVar182 * fVar214;
    auVar21._0_4_ = fVar226 * fVar181 * fVar213;
    fVar228 = auVar280._8_4_;
    auVar21._8_4_ = fVar228 * fVar183 * fVar216;
    fVar229 = auVar280._12_4_;
    auVar21._12_4_ = fVar229 * fVar184 * fVar218;
    fVar230 = auVar280._16_4_;
    auVar21._16_4_ = fVar230 * fVar219 * 0.0;
    fVar235 = auVar280._20_4_;
    auVar21._20_4_ = fVar235 * fVar225 * 0.0;
    fVar240 = auVar280._24_4_;
    auVar21._24_4_ = fVar240 * fVar241 * 0.0;
    auVar21._28_4_ = 0x3fc00000;
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,local_a00);
    auVar234 = ZEXT3264(auVar11);
    auVar88 = vfmadd231ps_fma(auVar21,auVar11,auVar19);
    auVar22._4_4_ = fVar268 * fVar214;
    auVar22._0_4_ = fVar242 * fVar213;
    auVar22._8_4_ = fVar269 * fVar216;
    auVar22._12_4_ = fVar271 * fVar218;
    auVar22._16_4_ = fVar272 * 0.0;
    auVar22._20_4_ = fVar273 * 0.0;
    auVar22._24_4_ = fVar274 * 0.0;
    auVar22._28_4_ = uVar84;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar22,_local_940);
    auVar267 = ZEXT1664(auVar89);
    auVar277 = ZEXT832(0) << 0x20;
    auVar210 = vsubps_avx(auVar277,auVar129);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar210,auVar22);
    auVar102 = vsqrtps_avx(auVar101);
    auVar23._4_4_ = fVar227 * (float)local_960._4_4_;
    auVar23._0_4_ = fVar226 * (float)local_960._0_4_;
    auVar23._8_4_ = fVar228 * fStack_958;
    auVar23._12_4_ = fVar229 * fStack_954;
    auVar23._16_4_ = fVar230 * fStack_950;
    auVar23._20_4_ = fVar235 * fStack_94c;
    auVar23._24_4_ = fVar240 * fStack_948;
    auVar23._28_4_ = uVar84;
    auVar148 = vfmadd231ps_fma(auVar23,_local_880,auVar11);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),_local_940,auVar210);
    fVar197 = auVar88._0_4_;
    fVar241 = auVar89._0_4_;
    fVar215 = auVar88._4_4_;
    fVar242 = auVar89._4_4_;
    fVar217 = auVar88._8_4_;
    fVar268 = auVar89._8_4_;
    fVar181 = auVar88._12_4_;
    fVar269 = auVar89._12_4_;
    uVar84 = local_880._28_4_;
    auVar24._28_4_ = uVar84;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar269 * fVar181,
                            CONCAT48(fVar268 * fVar217,CONCAT44(fVar242 * fVar215,fVar241 * fVar197)
                                    )));
    auVar111 = vsubps_avx(ZEXT1632(auVar148),auVar24);
    auVar25._4_4_ = fVar227 * fVar227;
    auVar25._0_4_ = fVar226 * fVar226;
    auVar25._8_4_ = fVar228 * fVar228;
    auVar25._12_4_ = fVar229 * fVar229;
    auVar25._16_4_ = fVar230 * fVar230;
    auVar25._20_4_ = fVar235 * fVar235;
    auVar25._24_4_ = fVar240 * fVar240;
    auVar25._28_4_ = uVar84;
    auVar148 = vfmadd231ps_fma(auVar25,auVar11,auVar11);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar210,auVar210);
    auVar26._28_4_ = auVar101._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar181 * fVar181,
                            CONCAT48(fVar217 * fVar217,CONCAT44(fVar215 * fVar215,fVar197 * fVar197)
                                    )));
    auVar131 = vsubps_avx(ZEXT1632(auVar148),auVar26);
    fVar185 = auVar102._28_4_ + auVar160._28_4_;
    fVar197 = (auVar102._0_4_ + auVar160._0_4_) * 1.0000002;
    fVar215 = (auVar102._4_4_ + auVar160._4_4_) * 1.0000002;
    fVar217 = (auVar102._8_4_ + auVar160._8_4_) * 1.0000002;
    fVar181 = (auVar102._12_4_ + auVar160._12_4_) * 1.0000002;
    fVar182 = (auVar102._16_4_ + auVar160._16_4_) * 1.0000002;
    fVar183 = (auVar102._20_4_ + auVar160._20_4_) * 1.0000002;
    fVar184 = (auVar102._24_4_ + auVar160._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar215 * fVar215;
    auVar27._0_4_ = fVar197 * fVar197;
    auVar27._8_4_ = fVar217 * fVar217;
    auVar27._12_4_ = fVar181 * fVar181;
    auVar27._16_4_ = fVar182 * fVar182;
    auVar27._20_4_ = fVar183 * fVar183;
    auVar27._24_4_ = fVar184 * fVar184;
    auVar27._28_4_ = fVar185;
    fVar219 = auVar111._0_4_ + auVar111._0_4_;
    fVar225 = auVar111._4_4_ + auVar111._4_4_;
    local_320._0_8_ = CONCAT44(fVar225,fVar219);
    local_320._8_4_ = auVar111._8_4_ + auVar111._8_4_;
    local_320._12_4_ = auVar111._12_4_ + auVar111._12_4_;
    local_320._16_4_ = auVar111._16_4_ + auVar111._16_4_;
    local_320._20_4_ = auVar111._20_4_ + auVar111._20_4_;
    local_320._24_4_ = auVar111._24_4_ + auVar111._24_4_;
    fVar197 = auVar111._28_4_;
    local_320._28_4_ = fVar197 + fVar197;
    auVar160 = vsubps_avx(auVar131,auVar27);
    auVar265 = ZEXT1632(auVar89);
    local_a20._28_4_ = fVar185;
    local_a20._0_28_ =
         ZEXT1628(CONCAT412(fVar269 * fVar269,
                            CONCAT48(fVar268 * fVar268,CONCAT44(fVar242 * fVar242,fVar241 * fVar241)
                                    )));
    local_3c0 = vsubps_avx(local_240,local_a20);
    auVar28._4_4_ = fVar225 * fVar225;
    auVar28._0_4_ = fVar219 * fVar219;
    auVar28._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar28._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar28._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar28._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar28._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar28._28_4_ = fVar197;
    fVar197 = local_3c0._0_4_;
    local_280 = fVar197 * 4.0;
    fVar215 = local_3c0._4_4_;
    fStack_27c = fVar215 * 4.0;
    fVar217 = local_3c0._8_4_;
    fStack_278 = fVar217 * 4.0;
    fVar181 = local_3c0._12_4_;
    fStack_274 = fVar181 * 4.0;
    fVar182 = local_3c0._16_4_;
    fStack_270 = fVar182 * 4.0;
    fVar183 = local_3c0._20_4_;
    fStack_26c = fVar183 * 4.0;
    fVar184 = local_3c0._24_4_;
    fStack_268 = fVar184 * 4.0;
    uStack_264 = 0x40800000;
    auVar29._4_4_ = auVar160._4_4_ * fStack_27c;
    auVar29._0_4_ = auVar160._0_4_ * local_280;
    auVar29._8_4_ = auVar160._8_4_ * fStack_278;
    auVar29._12_4_ = auVar160._12_4_ * fStack_274;
    auVar29._16_4_ = auVar160._16_4_ * fStack_270;
    auVar29._20_4_ = auVar160._20_4_ * fStack_26c;
    auVar29._24_4_ = auVar160._24_4_ * fStack_268;
    auVar29._28_4_ = 0x40800000;
    auVar111 = vsubps_avx(auVar28,auVar29);
    auVar101 = vcmpps_avx(auVar111,auVar277,5);
    local_340._0_4_ = fVar197 + fVar197;
    local_340._4_4_ = fVar215 + fVar215;
    local_340._8_4_ = fVar217 + fVar217;
    local_340._12_4_ = fVar181 + fVar181;
    local_340._16_4_ = fVar182 + fVar182;
    local_340._20_4_ = fVar183 + fVar183;
    local_340._24_4_ = fVar184 + fVar184;
    local_340._28_4_ = local_3c0._28_4_ + local_3c0._28_4_;
    auVar208 = ZEXT1632(auVar88);
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar222._8_4_ = 0x7f800000;
      auVar222._0_8_ = 0x7f8000007f800000;
      auVar222._12_4_ = 0x7f800000;
      auVar222._16_4_ = 0x7f800000;
      auVar222._20_4_ = 0x7f800000;
      auVar222._24_4_ = 0x7f800000;
      auVar222._28_4_ = 0x7f800000;
      auVar281 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar10 = vsqrtps_avx(auVar111);
      auVar277 = vcmpps_avx(auVar111,auVar277,5);
      auVar111 = vrcpps_avx(local_340);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar105._16_4_ = 0x3f800000;
      auVar105._20_4_ = 0x3f800000;
      auVar105._24_4_ = 0x3f800000;
      auVar105._28_4_ = 0x3f800000;
      auVar89 = vfnmadd213ps_fma(auVar111,local_340,auVar105);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar111,auVar111);
      auVar282._0_8_ = CONCAT44(fVar225,fVar219) ^ 0x8000000080000000;
      auVar282._8_4_ = -local_320._8_4_;
      auVar282._12_4_ = -local_320._12_4_;
      auVar282._16_4_ = -local_320._16_4_;
      auVar282._20_4_ = -local_320._20_4_;
      auVar282._24_4_ = -local_320._24_4_;
      auVar282._28_4_ = -local_320._28_4_;
      auVar111 = vsubps_avx(auVar282,auVar10);
      auVar30._4_4_ = auVar111._4_4_ * auVar89._4_4_;
      auVar30._0_4_ = auVar111._0_4_ * auVar89._0_4_;
      auVar30._8_4_ = auVar111._8_4_ * auVar89._8_4_;
      auVar30._12_4_ = auVar111._12_4_ * auVar89._12_4_;
      auVar30._16_4_ = auVar111._16_4_ * 0.0;
      auVar30._20_4_ = auVar111._20_4_ * 0.0;
      auVar30._24_4_ = auVar111._24_4_ * 0.0;
      auVar30._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(auVar10,local_320);
      auVar278._0_4_ = auVar111._0_4_ * auVar89._0_4_;
      auVar278._4_4_ = auVar111._4_4_ * auVar89._4_4_;
      auVar278._8_4_ = auVar111._8_4_ * auVar89._8_4_;
      auVar278._12_4_ = auVar111._12_4_ * auVar89._12_4_;
      auVar278._16_4_ = auVar111._16_4_ * 0.0;
      auVar278._20_4_ = auVar111._20_4_ * 0.0;
      auVar278._24_4_ = auVar111._24_4_ * 0.0;
      auVar278._28_4_ = 0;
      auVar89 = vfmadd213ps_fma(auVar265,auVar30,auVar208);
      local_380 = fVar213 * auVar89._0_4_;
      fStack_37c = fVar214 * auVar89._4_4_;
      fStack_378 = fVar216 * auVar89._8_4_;
      fStack_374 = fVar218 * auVar89._12_4_;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar111 = vandps_avx(local_a20,local_8a0);
      auVar111 = vmaxps_avx(local_760,auVar111);
      auVar31._4_4_ = auVar111._4_4_ * 1.9073486e-06;
      auVar31._0_4_ = auVar111._0_4_ * 1.9073486e-06;
      auVar31._8_4_ = auVar111._8_4_ * 1.9073486e-06;
      auVar31._12_4_ = auVar111._12_4_ * 1.9073486e-06;
      auVar31._16_4_ = auVar111._16_4_ * 1.9073486e-06;
      auVar31._20_4_ = auVar111._20_4_ * 1.9073486e-06;
      auVar31._24_4_ = auVar111._24_4_ * 1.9073486e-06;
      auVar31._28_4_ = auVar111._28_4_;
      auVar111 = vandps_avx(local_3c0,local_8a0);
      auVar10 = vcmpps_avx(auVar111,auVar31,1);
      auVar89 = vfmadd213ps_fma(auVar265,auVar278,auVar208);
      auVar106._8_4_ = 0x7f800000;
      auVar106._0_8_ = 0x7f8000007f800000;
      auVar106._12_4_ = 0x7f800000;
      auVar106._16_4_ = 0x7f800000;
      auVar106._20_4_ = 0x7f800000;
      auVar106._24_4_ = 0x7f800000;
      auVar106._28_4_ = 0x7f800000;
      auVar222 = vblendvps_avx(auVar106,auVar30,auVar277);
      local_3a0 = fVar213 * auVar89._0_4_;
      fStack_39c = fVar214 * auVar89._4_4_;
      fStack_398 = fVar216 * auVar89._8_4_;
      fStack_394 = fVar218 * auVar89._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x7f800000;
      auVar175._8_4_ = 0xff800000;
      auVar175._0_8_ = 0xff800000ff800000;
      auVar175._12_4_ = 0xff800000;
      auVar175._16_4_ = 0xff800000;
      auVar175._20_4_ = 0xff800000;
      auVar175._24_4_ = 0xff800000;
      auVar175._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar175,auVar278,auVar277);
      auVar281 = ZEXT3264(auVar111);
      auVar12 = auVar277 & auVar10;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar101 = vandps_avx(auVar10,auVar277);
        auVar10 = vcmpps_avx(auVar160,_DAT_01f7b000,2);
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
        auVar117._8_4_ = 0x7f800000;
        auVar117._0_8_ = 0x7f8000007f800000;
        auVar117._12_4_ = 0x7f800000;
        auVar117._16_4_ = 0x7f800000;
        auVar117._20_4_ = 0x7f800000;
        auVar117._24_4_ = 0x7f800000;
        auVar117._28_4_ = 0x7f800000;
        auVar160 = vblendvps_avx(auVar117,auVar141,auVar10);
        auVar89 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar12 = vpmovsxwd_avx2(auVar89);
        auVar222 = vblendvps_avx(auVar222,auVar160,auVar12);
        auVar160 = vblendvps_avx(auVar141,auVar117,auVar10);
        auVar160 = vblendvps_avx(auVar111,auVar160,auVar12);
        auVar281 = ZEXT3264(auVar160);
        auVar180._0_8_ = auVar101._0_8_ ^ 0xffffffffffffffff;
        auVar180._8_4_ = auVar101._8_4_ ^ 0xffffffff;
        auVar180._12_4_ = auVar101._12_4_ ^ 0xffffffff;
        auVar180._16_4_ = auVar101._16_4_ ^ 0xffffffff;
        auVar180._20_4_ = auVar101._20_4_ ^ 0xffffffff;
        auVar180._24_4_ = auVar101._24_4_ ^ 0xffffffff;
        auVar180._28_4_ = auVar101._28_4_ ^ 0xffffffff;
        auVar101 = vorps_avx(auVar10,auVar180);
        auVar101 = vandps_avx(auVar277,auVar101);
      }
    }
    auVar287 = ZEXT3264(_local_940);
    auVar160 = local_740 & auVar101;
    auVar251 = ZEXT3264(CONCAT428(0x3f800000,
                                  CONCAT424(0x3f800000,
                                            CONCAT420(0x3f800000,
                                                      CONCAT416(0x3f800000,
                                                                CONCAT412(0x3f800000,
                                                                          CONCAT48(0x3f800000,
                                                                                                                                                                      
                                                  0x3f8000003f800000)))))));
    auVar258 = ZEXT3264(_local_980);
    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0x7f,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar160 >> 0xbf,0) != '\0') ||
        (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar160[0x1f] < '\0') {
      auVar251 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      fVar197 = *(float *)(ray + k * 4 + 0x100) - (float)local_9b0._0_4_;
      auVar176._4_4_ = fVar197;
      auVar176._0_4_ = fVar197;
      auVar176._8_4_ = fVar197;
      auVar176._12_4_ = fVar197;
      auVar176._16_4_ = fVar197;
      auVar176._20_4_ = fVar197;
      auVar176._24_4_ = fVar197;
      auVar176._28_4_ = fVar197;
      auVar111 = vminps_avx(auVar176,auVar281._0_32_);
      auVar32._4_4_ = fVar227 * auVar260._4_4_;
      auVar32._0_4_ = fVar226 * auVar260._0_4_;
      auVar32._8_4_ = fVar228 * auVar260._8_4_;
      auVar32._12_4_ = fVar229 * auVar260._12_4_;
      auVar32._16_4_ = fVar230 * auVar260._16_4_;
      auVar32._20_4_ = fVar235 * auVar260._20_4_;
      auVar32._24_4_ = fVar240 * auVar260._24_4_;
      auVar32._28_4_ = local_740._28_4_;
      auVar89 = vfmadd213ps_fma(auVar11,auVar255,auVar32);
      auVar69._4_4_ = fStack_35c;
      auVar69._0_4_ = local_360;
      auVar69._8_4_ = fStack_358;
      auVar69._12_4_ = fStack_354;
      auVar69._16_4_ = fStack_350;
      auVar69._20_4_ = fStack_34c;
      auVar69._24_4_ = fStack_348;
      auVar69._28_4_ = fStack_344;
      auVar11 = vmaxps_avx(auVar69,auVar222);
      auVar88 = vfmadd213ps_fma(auVar210,local_8c0,ZEXT1632(auVar89));
      auVar33._4_4_ = auVar260._4_4_ * (float)local_960._4_4_;
      auVar33._0_4_ = auVar260._0_4_ * (float)local_960._0_4_;
      auVar33._8_4_ = auVar260._8_4_ * fStack_958;
      auVar33._12_4_ = auVar260._12_4_ * fStack_954;
      auVar33._16_4_ = auVar260._16_4_ * fStack_950;
      auVar33._20_4_ = auVar260._20_4_ * fStack_94c;
      auVar33._24_4_ = auVar260._24_4_ * fStack_948;
      auVar33._28_4_ = auVar280._28_4_;
      auVar89 = vfmadd231ps_fma(auVar33,_local_880,auVar255);
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar89),_local_940,local_8c0);
      auVar160 = vandps_avx(ZEXT1632(auVar148),local_8a0);
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar280 = vcmpps_avx(auVar160,auVar107,1);
      auVar160 = vrcpps_avx(ZEXT1632(auVar148));
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = 0x3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar108._16_4_ = 0x3f800000;
      auVar108._20_4_ = 0x3f800000;
      auVar108._24_4_ = 0x3f800000;
      auVar108._28_4_ = 0x3f800000;
      auVar210 = ZEXT1632(auVar148);
      auVar89 = vfnmadd213ps_fma(auVar160,auVar210,auVar108);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar160,auVar160);
      auVar283._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
      auVar283._8_4_ = auVar148._8_4_ ^ 0x80000000;
      auVar283._12_4_ = auVar148._12_4_ ^ 0x80000000;
      auVar283._16_4_ = 0x80000000;
      auVar283._20_4_ = 0x80000000;
      auVar283._24_4_ = 0x80000000;
      auVar283._28_4_ = 0x80000000;
      auVar34._4_4_ = auVar89._4_4_ * -auVar88._4_4_;
      auVar34._0_4_ = auVar89._0_4_ * -auVar88._0_4_;
      auVar34._8_4_ = auVar89._8_4_ * -auVar88._8_4_;
      auVar34._12_4_ = auVar89._12_4_ * -auVar88._12_4_;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar160 = vcmpps_avx(auVar210,auVar283,1);
      auVar160 = vorps_avx(auVar280,auVar160);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar160 = vblendvps_avx(auVar34,auVar279,auVar160);
      auVar11 = vmaxps_avx(auVar11,auVar160);
      auVar234 = ZEXT3264(auVar11);
      auVar160 = vcmpps_avx(auVar210,auVar283,6);
      auVar160 = vorps_avx(auVar280,auVar160);
      auVar284._8_4_ = 0x7f800000;
      auVar284._0_8_ = 0x7f8000007f800000;
      auVar284._12_4_ = 0x7f800000;
      auVar284._16_4_ = 0x7f800000;
      auVar284._20_4_ = 0x7f800000;
      auVar284._24_4_ = 0x7f800000;
      auVar284._28_4_ = 0x7f800000;
      auVar287 = ZEXT3264(auVar284);
      auVar160 = vblendvps_avx(auVar34,auVar284,auVar160);
      auVar210 = vminps_avx(auVar111,auVar160);
      fVar197 = -local_a60._0_4_;
      fVar215 = -local_a60._4_4_;
      fVar217 = -local_a60._8_4_;
      fVar181 = -local_a60._12_4_;
      fVar182 = -local_a60._16_4_;
      fVar183 = -local_a60._20_4_;
      fVar184 = -local_a60._24_4_;
      auVar238._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
      auVar238._8_4_ = -local_a80._8_4_;
      auVar238._12_4_ = -local_a80._12_4_;
      auVar238._16_4_ = -local_a80._16_4_;
      auVar238._20_4_ = -local_a80._20_4_;
      auVar238._24_4_ = -local_a80._24_4_;
      auVar238._28_4_ = local_a80._28_4_ ^ 0x80000000;
      auVar280 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar160 = vsubps_avx(auVar280,auVar14);
      auVar280 = vsubps_avx(auVar280,auVar13);
      auVar35._4_4_ = auVar280._4_4_ * fVar215;
      auVar35._0_4_ = auVar280._0_4_ * fVar197;
      auVar35._8_4_ = auVar280._8_4_ * fVar217;
      auVar35._12_4_ = auVar280._12_4_ * fVar181;
      auVar35._16_4_ = auVar280._16_4_ * fVar182;
      auVar35._20_4_ = auVar280._20_4_ * fVar183;
      auVar35._24_4_ = auVar280._24_4_ * fVar184;
      auVar35._28_4_ = auVar280._28_4_;
      auVar89 = vfmadd231ps_fma(auVar35,auVar238,auVar160);
      uStack_c44 = auVar15._28_4_;
      auVar248._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
      auVar248._8_4_ = -auVar15._8_4_;
      auVar248._12_4_ = -auVar15._12_4_;
      auVar248._16_4_ = -auVar15._16_4_;
      auVar248._20_4_ = -auVar15._20_4_;
      auVar248._24_4_ = -auVar15._24_4_;
      auVar248._28_4_ = uStack_c44 ^ 0x80000000;
      auVar160 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar209);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar248,auVar160);
      auVar36._4_4_ = fVar215 * (float)local_960._4_4_;
      auVar36._0_4_ = fVar197 * (float)local_960._0_4_;
      auVar36._8_4_ = fVar217 * fStack_958;
      auVar36._12_4_ = fVar181 * fStack_954;
      auVar36._16_4_ = fVar182 * fStack_950;
      auVar36._20_4_ = fVar183 * fStack_94c;
      auVar36._24_4_ = fVar184 * fStack_948;
      auVar36._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar89 = vfmadd231ps_fma(auVar36,_local_880,auVar238);
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar248,_local_940);
      auVar160 = vandps_avx(ZEXT1632(auVar148),local_8a0);
      auVar111 = vrcpps_avx(ZEXT1632(auVar148));
      auVar109._8_4_ = 0x219392ef;
      auVar109._0_8_ = 0x219392ef219392ef;
      auVar109._12_4_ = 0x219392ef;
      auVar109._16_4_ = 0x219392ef;
      auVar109._20_4_ = 0x219392ef;
      auVar109._24_4_ = 0x219392ef;
      auVar109._28_4_ = 0x219392ef;
      auVar280 = vcmpps_avx(auVar160,auVar109,1);
      auVar209 = ZEXT1632(auVar148);
      auVar89 = vfnmadd213ps_fma(auVar111,auVar209,auVar108);
      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar111,auVar111);
      auVar249._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
      auVar249._8_4_ = auVar148._8_4_ ^ 0x80000000;
      auVar249._12_4_ = auVar148._12_4_ ^ 0x80000000;
      auVar249._16_4_ = 0x80000000;
      auVar249._20_4_ = 0x80000000;
      auVar249._24_4_ = 0x80000000;
      auVar249._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar89._4_4_ * -auVar88._4_4_;
      auVar37._0_4_ = auVar89._0_4_ * -auVar88._0_4_;
      auVar37._8_4_ = auVar89._8_4_ * -auVar88._8_4_;
      auVar37._12_4_ = auVar89._12_4_ * -auVar88._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar160 = vcmpps_avx(auVar209,auVar249,1);
      auVar160 = vorps_avx(auVar280,auVar160);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar160 = vblendvps_avx(auVar37,auVar110,auVar160);
      auVar281 = ZEXT3264(auVar160);
      auVar11 = vmaxps_avx(auVar11,auVar160);
      auVar160 = vcmpps_avx(auVar209,auVar249,6);
      auVar160 = vorps_avx(auVar280,auVar160);
      auVar160 = vblendvps_avx(auVar37,auVar284,auVar160);
      auVar101 = vandps_avx(auVar101,local_740);
      auVar239 = ZEXT3264(auVar101);
      local_3e0 = vminps_avx(auVar210,auVar160);
      auVar160 = vcmpps_avx(auVar11,local_3e0,2);
      auVar280 = auVar101 & auVar160;
      if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar280 >> 0x7f,0) == '\0') &&
            (auVar280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar280 >> 0xbf,0) == '\0') &&
          (auVar280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar280[0x1f]) {
        auVar251 = ZEXT3264(auVar108);
        auVar258 = ZEXT3264(_local_980);
      }
      else {
        auVar68._4_4_ = fStack_37c;
        auVar68._0_4_ = local_380;
        auVar68._8_4_ = fStack_378;
        auVar68._12_4_ = fStack_374;
        auVar68._16_4_ = uStack_370;
        auVar68._20_4_ = uStack_36c;
        auVar68._24_4_ = uStack_368;
        auVar68._28_4_ = uStack_364;
        auVar280 = vminps_avx(auVar68,auVar108);
        auVar234 = ZEXT864(0) << 0x20;
        auVar280 = vmaxps_avx(auVar280,ZEXT832(0) << 0x20);
        auVar67._4_4_ = fStack_39c;
        auVar67._0_4_ = local_3a0;
        auVar67._8_4_ = fStack_398;
        auVar67._12_4_ = fStack_394;
        auVar67._16_4_ = uStack_390;
        auVar67._20_4_ = uStack_38c;
        auVar67._24_4_ = uStack_388;
        auVar67._28_4_ = uStack_384;
        auVar210 = vminps_avx(auVar67,auVar108);
        auVar210 = vmaxps_avx(auVar210,ZEXT832(0) << 0x20);
        auVar38._4_4_ = (auVar280._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar280._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar280._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar280._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar280._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar280._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar280._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar280._28_4_ + 7.0;
        auVar89 = vfmadd213ps_fma(auVar38,auVar103,local_8e0);
        auVar39._4_4_ = (auVar210._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar210._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar210._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar210._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar210._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar210._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar210._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar210._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar39,auVar103,local_8e0);
        auVar280 = vminps_avx(auVar104,auVar194);
        auVar210 = vminps_avx(auVar16,auVar17);
        auVar280 = vminps_avx(auVar280,auVar210);
        auVar102 = vsubps_avx(auVar280,auVar102);
        auVar101 = vandps_avx(auVar101,auVar160);
        local_1a0 = ZEXT1632(auVar89);
        local_1c0 = ZEXT1632(auVar88);
        auVar40._4_4_ = auVar102._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar102._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar102._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar102._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar102._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar102._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar102._24_4_ * 0.99999976;
        auVar40._28_4_ = auVar102._28_4_;
        auVar160 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar42._4_4_ = auVar160._4_4_ * auVar160._4_4_;
        auVar42._0_4_ = auVar160._0_4_ * auVar160._0_4_;
        auVar42._8_4_ = auVar160._8_4_ * auVar160._8_4_;
        auVar42._12_4_ = auVar160._12_4_ * auVar160._12_4_;
        auVar42._16_4_ = auVar160._16_4_ * auVar160._16_4_;
        auVar42._20_4_ = auVar160._20_4_ * auVar160._20_4_;
        uVar41 = auVar160._28_4_;
        auVar42._24_4_ = auVar160._24_4_ * auVar160._24_4_;
        auVar42._28_4_ = uVar41;
        auVar102 = vsubps_avx(auVar131,auVar42);
        auVar43._4_4_ = auVar102._4_4_ * fStack_27c;
        auVar43._0_4_ = auVar102._0_4_ * local_280;
        auVar43._8_4_ = auVar102._8_4_ * fStack_278;
        auVar43._12_4_ = auVar102._12_4_ * fStack_274;
        auVar43._16_4_ = auVar102._16_4_ * fStack_270;
        auVar43._20_4_ = auVar102._20_4_ * fStack_26c;
        auVar43._24_4_ = auVar102._24_4_ * fStack_268;
        auVar43._28_4_ = uVar41;
        auVar280 = vsubps_avx(auVar28,auVar43);
        auVar160 = vcmpps_avx(auVar280,ZEXT832(0) << 0x20,5);
        auVar287 = ZEXT3264(auVar160);
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar160 >> 0xbf,0) == '\0') &&
            (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar160[0x1f]) {
          auVar209 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar247 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar131 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar142 = ZEXT864(0) << 0x20;
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
        }
        else {
          auVar111 = vrcpps_avx(local_340);
          auVar112._8_4_ = 0x3f800000;
          auVar112._0_8_ = 0x3f8000003f800000;
          auVar112._12_4_ = 0x3f800000;
          auVar112._16_4_ = 0x3f800000;
          auVar112._20_4_ = 0x3f800000;
          auVar112._24_4_ = 0x3f800000;
          auVar112._28_4_ = 0x3f800000;
          auVar89 = vfnmadd213ps_fma(local_340,auVar111,auVar112);
          auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar111,auVar111);
          auVar111 = vsqrtps_avx(auVar280);
          auVar250._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
          auVar250._8_4_ = -local_320._8_4_;
          auVar250._12_4_ = -local_320._12_4_;
          auVar250._16_4_ = -local_320._16_4_;
          auVar250._20_4_ = -local_320._20_4_;
          auVar250._24_4_ = -local_320._24_4_;
          auVar250._28_4_ = -local_320._28_4_;
          auVar131 = vsubps_avx(auVar250,auVar111);
          auVar111 = vsubps_avx(auVar111,local_320);
          fVar197 = auVar131._0_4_ * auVar89._0_4_;
          fVar215 = auVar131._4_4_ * auVar89._4_4_;
          auVar44._4_4_ = fVar215;
          auVar44._0_4_ = fVar197;
          fVar217 = auVar131._8_4_ * auVar89._8_4_;
          auVar44._8_4_ = fVar217;
          fVar181 = auVar131._12_4_ * auVar89._12_4_;
          auVar44._12_4_ = fVar181;
          fVar182 = auVar131._16_4_ * 0.0;
          auVar44._16_4_ = fVar182;
          fVar183 = auVar131._20_4_ * 0.0;
          auVar44._20_4_ = fVar183;
          fVar184 = auVar131._24_4_ * 0.0;
          auVar44._24_4_ = fVar184;
          auVar44._28_4_ = uVar41;
          fVar185 = auVar111._0_4_ * auVar89._0_4_;
          fVar219 = auVar111._4_4_ * auVar89._4_4_;
          auVar45._4_4_ = fVar219;
          auVar45._0_4_ = fVar185;
          fVar225 = auVar111._8_4_ * auVar89._8_4_;
          auVar45._8_4_ = fVar225;
          fVar226 = auVar111._12_4_ * auVar89._12_4_;
          auVar45._12_4_ = fVar226;
          fVar227 = auVar111._16_4_ * 0.0;
          auVar45._16_4_ = fVar227;
          fVar228 = auVar111._20_4_ * 0.0;
          auVar45._20_4_ = fVar228;
          fVar229 = auVar111._24_4_ * 0.0;
          auVar45._24_4_ = fVar229;
          auVar45._28_4_ = auVar210._28_4_;
          auVar89 = vfmadd213ps_fma(auVar265,auVar44,auVar208);
          auVar88 = vfmadd213ps_fma(auVar265,auVar45,auVar208);
          auVar210 = ZEXT1632(CONCAT412(fVar218 * auVar89._12_4_,
                                        CONCAT48(fVar216 * auVar89._8_4_,
                                                 CONCAT44(fVar214 * auVar89._4_4_,
                                                          fVar213 * auVar89._0_4_))));
          auVar111 = ZEXT1632(CONCAT412(fVar218 * auVar88._12_4_,
                                        CONCAT48(fVar216 * auVar88._8_4_,
                                                 CONCAT44(fVar214 * auVar88._4_4_,
                                                          fVar213 * auVar88._0_4_))));
          auVar89 = vfmadd213ps_fma(local_2e0,auVar210,auVar129);
          auVar88 = vfmadd213ps_fma(local_2e0,auVar111,auVar129);
          auVar148 = vfmadd213ps_fma(local_300,auVar210,local_a00);
          auVar120 = vfmadd213ps_fma(local_300,auVar111,local_a00);
          auVar87 = vfmadd213ps_fma(auVar210,local_2c0,local_2a0);
          auVar143 = vfmadd213ps_fma(local_2c0,auVar111,local_2a0);
          auVar46._4_4_ = (float)local_940._4_4_ * fVar215;
          auVar46._0_4_ = (float)local_940._0_4_ * fVar197;
          auVar46._8_4_ = fStack_938 * fVar217;
          auVar46._12_4_ = fStack_934 * fVar181;
          auVar46._16_4_ = fStack_930 * fVar182;
          auVar46._20_4_ = fStack_92c * fVar183;
          auVar46._24_4_ = fStack_928 * fVar184;
          auVar46._28_4_ = 0;
          auVar111 = vsubps_avx(auVar46,ZEXT1632(auVar89));
          auVar47._4_4_ = (float)local_880._4_4_ * fVar215;
          auVar47._0_4_ = (float)local_880._0_4_ * fVar197;
          auVar47._8_4_ = fStack_878 * fVar217;
          auVar47._12_4_ = fStack_874 * fVar181;
          auVar47._16_4_ = fStack_870 * fVar182;
          auVar47._20_4_ = fStack_86c * fVar183;
          auVar47._24_4_ = fStack_868 * fVar184;
          auVar47._28_4_ = 0x80000000;
          auVar131 = vsubps_avx(auVar47,ZEXT1632(auVar148));
          auVar158._0_4_ = (float)local_960._0_4_ * fVar197;
          auVar158._4_4_ = (float)local_960._4_4_ * fVar215;
          auVar158._8_4_ = fStack_958 * fVar217;
          auVar158._12_4_ = fStack_954 * fVar181;
          auVar158._16_4_ = fStack_950 * fVar182;
          auVar158._20_4_ = fStack_94c * fVar183;
          auVar158._24_4_ = fStack_948 * fVar184;
          auVar158._28_4_ = 0;
          auVar210 = vsubps_avx(auVar158,ZEXT1632(auVar87));
          auVar142 = ZEXT3264(auVar210);
          auVar211._0_4_ = fVar185 * (float)local_940._0_4_;
          auVar211._4_4_ = fVar219 * (float)local_940._4_4_;
          auVar211._8_4_ = fVar225 * fStack_938;
          auVar211._12_4_ = fVar226 * fStack_934;
          auVar211._16_4_ = fVar227 * fStack_930;
          auVar211._20_4_ = fVar228 * fStack_92c;
          auVar211._24_4_ = fVar229 * fStack_928;
          auVar211._28_4_ = 0;
          auVar210 = vsubps_avx(auVar211,ZEXT1632(auVar88));
          auVar234 = ZEXT3264(auVar210);
          auVar48._4_4_ = (float)local_880._4_4_ * fVar219;
          auVar48._0_4_ = (float)local_880._0_4_ * fVar185;
          auVar48._8_4_ = fStack_878 * fVar225;
          auVar48._12_4_ = fStack_874 * fVar226;
          auVar48._16_4_ = fStack_870 * fVar227;
          auVar48._20_4_ = fStack_86c * fVar228;
          auVar48._24_4_ = fStack_868 * fVar229;
          auVar48._28_4_ = 0;
          auVar209 = vsubps_avx(auVar48,ZEXT1632(auVar120));
          auVar49._4_4_ = (float)local_960._4_4_ * fVar219;
          auVar49._0_4_ = (float)local_960._0_4_ * fVar185;
          auVar49._8_4_ = fStack_958 * fVar225;
          auVar49._12_4_ = fStack_954 * fVar226;
          auVar49._16_4_ = fStack_950 * fVar227;
          auVar49._20_4_ = fStack_94c * fVar228;
          auVar49._24_4_ = fStack_948 * fVar229;
          auVar49._28_4_ = uVar84;
          auVar210 = vsubps_avx(auVar49,ZEXT1632(auVar143));
          auVar247 = auVar210._0_28_;
          auVar210 = vcmpps_avx(auVar280,_DAT_01f7b000,5);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar261 = vblendvps_avx(auVar262,auVar44,auVar210);
          auVar280 = vandps_avx(local_8a0,local_a20);
          auVar280 = vmaxps_avx(local_760,auVar280);
          auVar50._4_4_ = auVar280._4_4_ * 1.9073486e-06;
          auVar50._0_4_ = auVar280._0_4_ * 1.9073486e-06;
          auVar50._8_4_ = auVar280._8_4_ * 1.9073486e-06;
          auVar50._12_4_ = auVar280._12_4_ * 1.9073486e-06;
          auVar50._16_4_ = auVar280._16_4_ * 1.9073486e-06;
          auVar50._20_4_ = auVar280._20_4_ * 1.9073486e-06;
          auVar50._24_4_ = auVar280._24_4_ * 1.9073486e-06;
          auVar50._28_4_ = auVar280._28_4_;
          auVar280 = vandps_avx(local_8a0,local_3c0);
          auVar280 = vcmpps_avx(auVar280,auVar50,1);
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          auVar266 = vblendvps_avx(auVar223,auVar45,auVar210);
          auVar13 = auVar210 & auVar280;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar13 >> 0x7f,0) == '\0') &&
                (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar13 >> 0xbf,0) == '\0') &&
              (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar13[0x1f]) {
            auVar287 = ZEXT3264(auVar160);
          }
          else {
            auVar160 = vandps_avx(auVar280,auVar210);
            auVar280 = vcmpps_avx(auVar102,_DAT_01f7b000,2);
            auVar196._8_4_ = 0x7f800000;
            auVar196._0_8_ = 0x7f8000007f800000;
            auVar196._12_4_ = 0x7f800000;
            auVar196._16_4_ = 0x7f800000;
            auVar196._20_4_ = 0x7f800000;
            auVar196._24_4_ = 0x7f800000;
            auVar196._28_4_ = 0x7f800000;
            auVar285._8_4_ = 0xff800000;
            auVar285._0_8_ = 0xff800000ff800000;
            auVar285._12_4_ = 0xff800000;
            auVar285._16_4_ = 0xff800000;
            auVar285._20_4_ = 0xff800000;
            auVar285._24_4_ = 0xff800000;
            auVar285._28_4_ = 0xff800000;
            auVar102 = vblendvps_avx(auVar196,auVar285,auVar280);
            auVar89 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar89);
            auVar261 = vblendvps_avx(auVar261,auVar102,auVar13);
            auVar286._8_4_ = 0xff800000;
            auVar286._0_8_ = 0xff800000ff800000;
            auVar286._12_4_ = 0xff800000;
            auVar286._16_4_ = 0xff800000;
            auVar286._20_4_ = 0xff800000;
            auVar286._24_4_ = 0xff800000;
            auVar286._28_4_ = 0xff800000;
            auVar102 = vblendvps_avx(auVar286,auVar196,auVar280);
            auVar266 = vblendvps_avx(auVar266,auVar102,auVar13);
            auVar224._0_8_ = auVar160._0_8_ ^ 0xffffffffffffffff;
            auVar224._8_4_ = auVar160._8_4_ ^ 0xffffffff;
            auVar224._12_4_ = auVar160._12_4_ ^ 0xffffffff;
            auVar224._16_4_ = auVar160._16_4_ ^ 0xffffffff;
            auVar224._20_4_ = auVar160._20_4_ ^ 0xffffffff;
            auVar224._24_4_ = auVar160._24_4_ ^ 0xffffffff;
            auVar224._28_4_ = auVar160._28_4_ ^ 0xffffffff;
            auVar160 = vorps_avx(auVar280,auVar224);
            auVar160 = vandps_avx(auVar210,auVar160);
            auVar287 = ZEXT3264(auVar160);
          }
        }
        local_560 = auVar11;
        local_540 = vminps_avx(local_3e0,auVar261);
        local_aa0 = vmaxps_avx(auVar11,auVar266);
        auVar281 = ZEXT3264(local_aa0);
        _local_400 = local_aa0;
        auVar160 = vcmpps_avx(auVar11,local_540,2);
        auVar239 = ZEXT3264(auVar160);
        local_800 = vandps_avx(auVar160,auVar101);
        auVar267 = ZEXT3264(local_800);
        auVar160 = vcmpps_avx(local_aa0,local_3e0,2);
        _local_ac0 = vandps_avx(auVar160,auVar101);
        auVar101 = vorps_avx(local_800,_local_ac0);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) {
          auVar251 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar258 = ZEXT3264(_local_980);
        }
        else {
          auVar51._4_4_ = (float)local_960._4_4_ * auVar247._4_4_;
          auVar51._0_4_ = (float)local_960._0_4_ * auVar247._0_4_;
          auVar51._8_4_ = fStack_958 * auVar247._8_4_;
          auVar51._12_4_ = fStack_954 * auVar247._12_4_;
          auVar51._16_4_ = fStack_950 * auVar247._16_4_;
          auVar51._20_4_ = fStack_94c * auVar247._20_4_;
          auVar51._24_4_ = fStack_948 * auVar247._24_4_;
          auVar51._28_4_ = auVar101._28_4_;
          auVar89 = vfmadd213ps_fma(auVar209,_local_880,auVar51);
          auVar239 = ZEXT3264(_local_880);
          auVar89 = vfmadd213ps_fma(auVar234._0_32_,_local_940,ZEXT1632(auVar89));
          auVar177._0_8_ = auVar287._0_8_ ^ 0xffffffffffffffff;
          auVar177._8_4_ = auVar287._8_4_ ^ 0xffffffff;
          auVar177._12_4_ = auVar287._12_4_ ^ 0xffffffff;
          auVar177._16_4_ = auVar287._16_4_ ^ 0xffffffff;
          auVar177._20_4_ = auVar287._20_4_ ^ 0xffffffff;
          auVar177._24_4_ = auVar287._24_4_ ^ 0xffffffff;
          auVar177._28_4_ = auVar287._28_4_ ^ 0xffffffff;
          auVar101 = vandps_avx(local_8a0,ZEXT1632(auVar89));
          auVar212._8_4_ = 0x3e99999a;
          auVar212._0_8_ = 0x3e99999a3e99999a;
          auVar212._12_4_ = 0x3e99999a;
          auVar212._16_4_ = 0x3e99999a;
          auVar212._20_4_ = 0x3e99999a;
          auVar212._24_4_ = 0x3e99999a;
          auVar212._28_4_ = 0x3e99999a;
          auVar101 = vcmpps_avx(auVar101,auVar212,1);
          local_840 = vorps_avx(auVar101,auVar177);
          auVar234._0_4_ = (float)local_960._0_4_ * auVar142._0_4_;
          auVar234._4_4_ = (float)local_960._4_4_ * auVar142._4_4_;
          auVar234._8_4_ = fStack_958 * auVar142._8_4_;
          auVar234._12_4_ = fStack_954 * auVar142._12_4_;
          auVar234._16_4_ = fStack_950 * auVar142._16_4_;
          auVar234._20_4_ = fStack_94c * auVar142._20_4_;
          auVar234._28_36_ = auVar142._28_36_;
          auVar234._24_4_ = fStack_948 * auVar142._24_4_;
          auVar89 = vfmadd213ps_fma(auVar131,_local_880,auVar234._0_32_);
          auVar234 = ZEXT3264(_local_ac0);
          auVar89 = vfmadd213ps_fma(auVar111,_local_940,ZEXT1632(auVar89));
          auVar101 = vandps_avx(local_8a0,ZEXT1632(auVar89));
          auVar101 = vcmpps_avx(auVar101,auVar212,1);
          auVar101 = vorps_avx(auVar101,auVar177);
          auVar132._8_4_ = 3;
          auVar132._0_8_ = 0x300000003;
          auVar132._12_4_ = 3;
          auVar132._16_4_ = 3;
          auVar132._20_4_ = 3;
          auVar132._24_4_ = 3;
          auVar132._28_4_ = 3;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar101 = vblendvps_avx(auVar159,auVar132,auVar101);
          local_860._4_4_ = local_ce4;
          local_860._0_4_ = local_ce4;
          local_860._8_4_ = local_ce4;
          local_860._12_4_ = local_ce4;
          local_860._16_4_ = local_ce4;
          local_860._20_4_ = local_ce4;
          local_860._24_4_ = local_ce4;
          local_860._28_4_ = local_ce4;
          local_820 = vpcmpgtd_avx2(auVar101,local_860);
          local_580 = vpandn_avx2(local_820,local_800);
          local_900._4_4_ = auVar11._4_4_ + (float)local_980._4_4_;
          local_900._0_4_ = auVar11._0_4_ + (float)local_980._0_4_;
          fStack_8f8 = auVar11._8_4_ + fStack_978;
          fStack_8f4 = auVar11._12_4_ + fStack_974;
          fStack_8f0 = auVar11._16_4_ + fStack_970;
          fStack_8ec = auVar11._20_4_ + fStack_96c;
          fStack_8e8 = auVar11._24_4_ + fStack_968;
          fStack_8e4 = auVar11._28_4_ + fStack_964;
          auVar142 = ZEXT3264(local_aa0);
          while( true ) {
            auVar101 = _local_400;
            fStack_b7c = auVar6._4_4_;
            fStack_b78 = auVar6._8_4_;
            fStack_b74 = auVar6._12_4_;
            if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_580 >> 0x7f,0) == '\0') &&
                  (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_580 >> 0xbf,0) == '\0') &&
                (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_580[0x1f]) break;
            auVar133._8_4_ = 0x7f800000;
            auVar133._0_8_ = 0x7f8000007f800000;
            auVar133._12_4_ = 0x7f800000;
            auVar133._16_4_ = 0x7f800000;
            auVar133._20_4_ = 0x7f800000;
            auVar133._24_4_ = 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar101 = vblendvps_avx(auVar133,auVar11,local_580);
            auVar160 = vshufps_avx(auVar101,auVar101,0xb1);
            auVar160 = vminps_avx(auVar101,auVar160);
            auVar102 = vshufpd_avx(auVar160,auVar160,5);
            auVar160 = vminps_avx(auVar160,auVar102);
            auVar102 = vpermpd_avx2(auVar160,0x4e);
            auVar160 = vminps_avx(auVar160,auVar102);
            auVar160 = vcmpps_avx(auVar101,auVar160,0);
            auVar102 = local_580 & auVar160;
            auVar101 = local_580;
            if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar102 >> 0x7f,0) != '\0') ||
                  (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0xbf,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar102[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar160,local_580);
            }
            uVar76 = vmovmskps_avx(auVar101);
            iVar75 = 0;
            for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar75 = iVar75 + 1;
            }
            uVar79 = (ulong)(uint)(iVar75 << 2);
            *(undefined4 *)(local_580 + uVar79) = 0;
            uVar76 = *(uint *)(local_1a0 + uVar79);
            uVar81 = *(uint *)(local_560 + uVar79);
            fVar197 = auVar4._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              auVar239 = ZEXT1664(auVar239._0_16_);
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar281 = ZEXT1664(auVar281._0_16_);
              auVar287 = ZEXT1664(auVar287._0_16_);
              fVar197 = sqrtf((float)local_a40._0_4_);
              uVar79 = extraout_RAX;
            }
            auVar88 = vminps_avx(auVar7,auVar9);
            auVar89 = vmaxps_avx(auVar7,auVar9);
            auVar148 = vminps_avx(auVar8,auVar6);
            auVar120 = vminps_avx(auVar88,auVar148);
            auVar88 = vmaxps_avx(auVar8,auVar6);
            auVar148 = vmaxps_avx(auVar89,auVar88);
            auVar89 = vandps_avx(auVar120,auVar236);
            auVar88 = vandps_avx(auVar148,auVar236);
            auVar89 = vmaxps_avx(auVar89,auVar88);
            auVar88 = vmovshdup_avx(auVar89);
            auVar88 = vmaxss_avx(auVar88,auVar89);
            auVar89 = vshufpd_avx(auVar89,auVar89,1);
            auVar89 = vmaxss_avx(auVar89,auVar88);
            local_a00._0_4_ = auVar89._0_4_ * 1.9073486e-06;
            local_8c0._0_4_ = fVar197 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar148,auVar148,0xff);
            auVar89 = vinsertps_avx(ZEXT416(uVar81),ZEXT416(uVar76),0x10);
            for (uVar83 = 0; bVar74 = (byte)uVar79, uVar83 != 5; uVar83 = uVar83 + 1) {
              fVar217 = auVar89._0_4_;
              auVar90._4_4_ = fVar217;
              auVar90._0_4_ = fVar217;
              auVar90._8_4_ = fVar217;
              auVar90._12_4_ = fVar217;
              auVar120 = vfmadd213ps_fma(auVar90,local_a30,_DAT_01f45a50);
              auVar148 = vmovshdup_avx(auVar89);
              fVar218 = auVar148._0_4_;
              fVar216 = 1.0 - fVar218;
              auVar91 = SUB6416(ZEXT464(0x40400000),0);
              auVar162 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar87 = vfmadd213ss_fma(auVar91,auVar148,auVar162);
              auVar88 = vfmadd213ss_fma(auVar87,ZEXT416((uint)(fVar218 * fVar218)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar143 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar216),auVar162);
              auVar143 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(fVar216 * fVar216)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar197 = fVar216 * fVar216 * -fVar218 * 0.5;
              fVar213 = auVar88._0_4_ * 0.5;
              fVar214 = auVar143._0_4_ * 0.5;
              fVar215 = fVar218 * fVar218 * -fVar216 * 0.5;
              auVar163._0_4_ = fVar215 * fVar118;
              auVar163._4_4_ = fVar215 * fStack_b7c;
              auVar163._8_4_ = fVar215 * fStack_b78;
              auVar163._12_4_ = fVar215 * fStack_b74;
              auVar188._4_4_ = fVar214;
              auVar188._0_4_ = fVar214;
              auVar188._8_4_ = fVar214;
              auVar188._12_4_ = fVar214;
              auVar88 = vfmadd132ps_fma(auVar188,auVar163,auVar8);
              auVar144._4_4_ = fVar213;
              auVar144._0_4_ = fVar213;
              auVar144._8_4_ = fVar213;
              auVar144._12_4_ = fVar213;
              auVar88 = vfmadd132ps_fma(auVar144,auVar88,auVar9);
              auVar164._4_4_ = fVar197;
              auVar164._0_4_ = fVar197;
              auVar164._8_4_ = fVar197;
              auVar164._12_4_ = fVar197;
              local_920 = vfmadd132ps_fma(auVar164,auVar88,auVar7);
              auVar187 = vfmadd231ss_fma(auVar162,auVar148,ZEXT416(0x41100000));
              auVar143 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar148,ZEXT416(0x40800000)
                                        );
              auVar120 = vsubps_avx(auVar120,local_920);
              auVar88 = vdpps_avx(auVar120,auVar120,0x7f);
              auVar162 = vfmadd213ss_fma(auVar91,auVar148,ZEXT416(0xbf800000));
              fVar197 = auVar88._0_4_;
              if (fVar197 < 0.0) {
                local_a60._0_16_ = auVar187;
                local_a80._0_4_ = fVar216 * -2.0;
                auVar239._0_4_ = sqrtf(fVar197);
                auVar239._4_60_ = extraout_var;
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar91 = auVar239._0_16_;
                uVar79 = extraout_RAX_00;
                fVar213 = (float)local_a80._0_4_;
                auVar187 = local_a60._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(auVar88,auVar88);
                fVar213 = fVar216 * -2.0;
              }
              auVar287 = ZEXT1664(auVar187);
              auVar119 = vfmadd213ss_fma(auVar87,ZEXT416((uint)(fVar218 + fVar218)),
                                         ZEXT416((uint)(fVar218 * fVar218 * 3.0)));
              auVar199 = SUB6416(ZEXT464(0x40000000),0);
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar148,auVar199);
              auVar186 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216 * -3.0)),
                                         ZEXT416((uint)(fVar216 + fVar216)),auVar87);
              auVar198 = vfnmadd231ss_fma(ZEXT416((uint)(fVar218 * (fVar216 + fVar216))),
                                          ZEXT416((uint)fVar216),ZEXT416((uint)fVar216));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar213),auVar148,
                                        ZEXT416((uint)(fVar218 * fVar218)));
              fVar213 = auVar186._0_4_ * 0.5;
              fVar214 = auVar87._0_4_ * 0.5;
              auVar145._0_4_ = fVar118 * fVar214;
              auVar145._4_4_ = fStack_b7c * fVar214;
              auVar145._8_4_ = fStack_b78 * fVar214;
              auVar145._12_4_ = fStack_b74 * fVar214;
              auVar121._4_4_ = fVar213;
              auVar121._0_4_ = fVar213;
              auVar121._8_4_ = fVar213;
              auVar121._12_4_ = fVar213;
              auVar87 = vfmadd213ps_fma(auVar121,auVar8,auVar145);
              fVar213 = auVar198._0_4_ * 0.5;
              fVar214 = auVar119._0_4_ * 0.5;
              auVar146._4_4_ = fVar214;
              auVar146._0_4_ = fVar214;
              auVar146._8_4_ = fVar214;
              auVar146._12_4_ = fVar214;
              auVar87 = vfmadd213ps_fma(auVar146,auVar9,auVar87);
              auVar253._4_4_ = fVar213;
              auVar253._0_4_ = fVar213;
              auVar253._8_4_ = fVar213;
              auVar253._12_4_ = fVar213;
              auVar119 = vfmadd213ps_fma(auVar253,auVar7,auVar87);
              auVar186 = vfmadd213ss_fma(auVar148,SUB6416(ZEXT464(0xc0400000),0),auVar199);
              local_c00 = auVar162._0_4_;
              auVar92._0_4_ = fVar118 * local_c00;
              auVar92._4_4_ = fStack_b7c * local_c00;
              auVar92._8_4_ = fStack_b78 * local_c00;
              auVar92._12_4_ = fStack_b74 * local_c00;
              local_b20 = auVar143._0_4_;
              auVar122._4_4_ = local_b20;
              auVar122._0_4_ = local_b20;
              auVar122._8_4_ = local_b20;
              auVar122._12_4_ = local_b20;
              auVar148 = vfmadd213ps_fma(auVar122,auVar8,auVar92);
              uVar84 = auVar187._0_4_;
              auVar147._4_4_ = uVar84;
              auVar147._0_4_ = uVar84;
              auVar147._8_4_ = uVar84;
              auVar147._12_4_ = uVar84;
              auVar148 = vfmadd213ps_fma(auVar147,auVar9,auVar148);
              auVar87 = vdpps_avx(auVar119,auVar119,0x7f);
              uVar84 = auVar186._0_4_;
              auVar123._4_4_ = uVar84;
              auVar123._0_4_ = uVar84;
              auVar123._8_4_ = uVar84;
              auVar123._12_4_ = uVar84;
              auVar162 = vfmadd213ps_fma(auVar123,auVar7,auVar148);
              auVar148 = vblendps_avx(auVar87,_DAT_01f45a50,0xe);
              auVar143 = vrsqrtss_avx(auVar148,auVar148);
              fVar215 = auVar87._0_4_;
              fVar213 = auVar143._0_4_;
              auVar143 = vdpps_avx(auVar119,auVar162,0x7f);
              fVar213 = fVar213 * 1.5 + fVar215 * -0.5 * fVar213 * fVar213 * fVar213;
              auVar124._0_4_ = auVar162._0_4_ * fVar215;
              auVar124._4_4_ = auVar162._4_4_ * fVar215;
              auVar124._8_4_ = auVar162._8_4_ * fVar215;
              auVar124._12_4_ = auVar162._12_4_ * fVar215;
              fVar214 = auVar143._0_4_;
              auVar202._0_4_ = auVar119._0_4_ * fVar214;
              auVar202._4_4_ = auVar119._4_4_ * fVar214;
              fVar216 = auVar119._8_4_;
              auVar202._8_4_ = fVar216 * fVar214;
              fVar218 = auVar119._12_4_;
              auVar202._12_4_ = fVar218 * fVar214;
              auVar143 = vsubps_avx(auVar124,auVar202);
              auVar148 = vrcpss_avx(auVar148,auVar148);
              auVar162 = vfnmadd213ss_fma(auVar148,auVar87,auVar199);
              fVar214 = auVar148._0_4_ * auVar162._0_4_;
              auVar148 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                    ZEXT416((uint)(fVar217 * (float)local_8c0._0_4_)));
              auVar251 = ZEXT1664(auVar148);
              auVar245._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = -fVar216;
              auVar245._12_4_ = -fVar218;
              auVar165._0_4_ = fVar213 * auVar143._0_4_ * fVar214;
              auVar165._4_4_ = fVar213 * auVar143._4_4_ * fVar214;
              auVar165._8_4_ = fVar213 * auVar143._8_4_ * fVar214;
              auVar165._12_4_ = fVar213 * auVar143._12_4_ * fVar214;
              auVar264._0_4_ = auVar119._0_4_ * fVar213;
              auVar264._4_4_ = auVar119._4_4_ * fVar213;
              auVar264._8_4_ = fVar216 * fVar213;
              auVar264._12_4_ = fVar218 * fVar213;
              if (fVar215 < -fVar215) {
                auVar287 = ZEXT1664(auVar187);
                fVar213 = sqrtf(fVar215);
                auVar251 = ZEXT464(auVar148._0_4_);
                auVar91 = ZEXT416(auVar91._0_4_);
                uVar79 = extraout_RAX_01;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar213 = auVar87._0_4_;
              }
              auVar87 = vdpps_avx(auVar120,auVar264,0x7f);
              auVar186 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar91,auVar251._0_16_);
              auVar143 = vdpps_avx(auVar245,auVar264,0x7f);
              auVar162 = vdpps_avx(auVar120,auVar165,0x7f);
              auVar187 = vdpps_avx(local_a30,auVar264,0x7f);
              auVar186 = vfmadd213ss_fma(ZEXT416((uint)(auVar91._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_a00._0_4_ / fVar213)),auVar186)
              ;
              fVar213 = auVar143._0_4_ + auVar162._0_4_;
              auVar267 = ZEXT464((uint)fVar213);
              fVar215 = auVar87._0_4_;
              auVar93._0_4_ = fVar215 * fVar215;
              auVar93._4_4_ = auVar87._4_4_ * auVar87._4_4_;
              auVar93._8_4_ = auVar87._8_4_ * auVar87._8_4_;
              auVar93._12_4_ = auVar87._12_4_ * auVar87._12_4_;
              auVar143 = vdpps_avx(auVar120,auVar245,0x7f);
              auVar91 = vsubps_avx(auVar88,auVar93);
              auVar162 = vrsqrtss_avx(auVar91,auVar91);
              fVar216 = auVar91._0_4_;
              fVar214 = auVar162._0_4_;
              fVar214 = fVar214 * 1.5 + fVar216 * -0.5 * fVar214 * fVar214 * fVar214;
              auVar162 = vdpps_avx(auVar120,local_a30,0x7f);
              auVar143 = vfnmadd231ss_fma(auVar143,auVar87,ZEXT416((uint)fVar213));
              auVar162 = vfnmadd231ss_fma(auVar162,auVar87,auVar187);
              if (fVar216 < 0.0) {
                local_a60._0_16_ = auVar143;
                local_a80._0_4_ = fVar214;
                local_a20._0_16_ = auVar162;
                auVar287 = ZEXT1664(auVar287._0_16_);
                fVar216 = sqrtf(fVar216);
                auVar267 = ZEXT1664(ZEXT416((uint)fVar213));
                auVar251 = ZEXT464(auVar148._0_4_);
                uVar79 = extraout_RAX_02;
                fVar214 = (float)local_a80._0_4_;
                auVar162 = local_a20._0_16_;
                auVar143 = local_a60._0_16_;
              }
              else {
                auVar148 = vsqrtss_avx(auVar91,auVar91);
                fVar216 = auVar148._0_4_;
              }
              auVar239 = ZEXT1664(auVar88);
              auVar148 = vpermilps_avx(local_920,0xff);
              fVar216 = fVar216 - auVar148._0_4_;
              auVar91 = vshufps_avx(auVar119,auVar119,0xff);
              auVar198 = vfmsub213ss_fma(auVar143,ZEXT416((uint)fVar214),auVar91);
              auVar281 = ZEXT1664(auVar198);
              auVar166._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
              auVar166._8_4_ = auVar187._8_4_ ^ 0x80000000;
              auVar166._12_4_ = auVar187._12_4_ ^ 0x80000000;
              auVar189._0_8_ = auVar198._0_8_ ^ 0x8000000080000000;
              auVar189._8_4_ = auVar198._8_4_ ^ 0x80000000;
              auVar189._12_4_ = auVar198._12_4_ ^ 0x80000000;
              auVar148 = ZEXT416((uint)(auVar162._0_4_ * fVar214));
              auVar162 = auVar267._0_16_;
              auVar143 = vfmsub231ss_fma(ZEXT416((uint)(auVar187._0_4_ * auVar198._0_4_)),auVar162,
                                         auVar148);
              auVar148 = vinsertps_avx(auVar189,auVar148,0x1c);
              uVar84 = auVar143._0_4_;
              auVar190._4_4_ = uVar84;
              auVar190._0_4_ = uVar84;
              auVar190._8_4_ = uVar84;
              auVar190._12_4_ = uVar84;
              auVar148 = vdivps_avx(auVar148,auVar190);
              auVar143 = vinsertps_avx(auVar162,auVar166,0x10);
              auVar143 = vdivps_avx(auVar143,auVar190);
              auVar149._0_4_ = fVar215 * auVar148._0_4_ + fVar216 * auVar143._0_4_;
              auVar149._4_4_ = fVar215 * auVar148._4_4_ + fVar216 * auVar143._4_4_;
              auVar149._8_4_ = fVar215 * auVar148._8_4_ + fVar216 * auVar143._8_4_;
              auVar149._12_4_ = fVar215 * auVar148._12_4_ + fVar216 * auVar143._12_4_;
              auVar89 = vsubps_avx(auVar89,auVar149);
              auVar148 = vandps_avx(auVar87,auVar236);
              if (auVar148._0_4_ < auVar186._0_4_) {
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar186._0_4_ + auVar251._0_4_)),
                                          local_8e0._0_16_,ZEXT416(0x36000000));
                auVar148 = vandps_avx(ZEXT416((uint)fVar216),auVar236);
                if (auVar148._0_4_ < auVar87._0_4_) {
                  bVar85 = uVar83 < 5;
                  fVar213 = auVar89._0_4_ + (float)local_9b0._0_4_;
                  if (fVar213 < fVar86) {
                    bVar74 = 0;
                    goto LAB_01171c3f;
                  }
                  fVar214 = *(float *)(ray + k * 4 + 0x100);
                  auVar142 = ZEXT3264(local_aa0);
                  auVar234 = ZEXT3264(_local_ac0);
                  if (fVar213 <= fVar214) {
                    auVar89 = vmovshdup_avx(auVar89);
                    bVar74 = 0;
                    if ((auVar89._0_4_ < 0.0) || (bVar74 = 0, 1.0 < auVar89._0_4_))
                    goto LAB_01171c5a;
                    auVar148 = vrsqrtss_avx(auVar88,auVar88);
                    fVar215 = auVar148._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar77].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar74 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01171c5a;
                      fVar197 = fVar215 * 1.5 + fVar197 * -0.5 * fVar215 * fVar215 * fVar215;
                      local_bc0 = auVar120._0_4_;
                      fStack_bbc = auVar120._4_4_;
                      fStack_bb8 = auVar120._8_4_;
                      fStack_bb4 = auVar120._12_4_;
                      auVar167._0_4_ = fVar197 * local_bc0;
                      auVar167._4_4_ = fVar197 * fStack_bbc;
                      auVar167._8_4_ = fVar197 * fStack_bb8;
                      auVar167._12_4_ = fVar197 * fStack_bb4;
                      auVar143 = vfmadd213ps_fma(auVar91,auVar167,auVar119);
                      auVar148 = vshufps_avx(auVar167,auVar167,0xc9);
                      auVar120 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar168._0_4_ = auVar167._0_4_ * auVar120._0_4_;
                      auVar168._4_4_ = auVar167._4_4_ * auVar120._4_4_;
                      auVar168._8_4_ = auVar167._8_4_ * auVar120._8_4_;
                      auVar168._12_4_ = auVar167._12_4_ * auVar120._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar168,auVar119,auVar148);
                      auVar148 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar120 = vshufps_avx(auVar143,auVar143,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar94._0_4_ = auVar143._0_4_ * auVar87._0_4_;
                      auVar94._4_4_ = auVar143._4_4_ * auVar87._4_4_;
                      auVar94._8_4_ = auVar143._8_4_ * auVar87._8_4_;
                      auVar94._12_4_ = auVar143._12_4_ * auVar87._12_4_;
                      auVar148 = vfmsub231ps_fma(auVar94,auVar148,auVar120);
                      local_4c0 = auVar89._0_8_;
                      auVar89 = vmovshdup_avx(auVar148);
                      local_520._8_8_ = auVar89._0_8_;
                      auVar89 = vshufps_avx(auVar148,auVar148,0xaa);
                      local_500 = auVar89._0_8_;
                      local_4e0 = auVar148._0_4_;
                      local_520._0_8_ = local_520._8_8_;
                      local_520._16_8_ = local_520._8_8_;
                      local_520._24_8_ = local_520._8_8_;
                      uStack_4f8 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4e8 = local_500;
                      uStack_4dc = local_4e0;
                      uStack_4d8 = local_4e0;
                      uStack_4d4 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4cc = local_4e0;
                      uStack_4c8 = local_4e0;
                      uStack_4c4 = local_4e0;
                      uStack_4b8 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4a8 = local_4c0;
                      auVar150._12_4_ = 0;
                      auVar150._0_12_ = ZEXT812(0);
                      auVar150 = auVar150 << 0x20;
                      local_4a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_480 = CONCAT44(uStack_79c,local_7a0);
                      uStack_478 = CONCAT44(uStack_794,uStack_798);
                      uStack_470 = CONCAT44(uStack_78c,uStack_790);
                      uStack_468 = CONCAT44(uStack_784,uStack_788);
                      local_460._4_4_ = uStack_77c;
                      local_460._0_4_ = local_780;
                      local_460._8_4_ = uStack_778;
                      local_460._12_4_ = uStack_774;
                      local_460._16_4_ = uStack_770;
                      local_460._20_4_ = uStack_76c;
                      local_460._24_4_ = uStack_768;
                      local_460._28_4_ = uStack_764;
                      vpcmpeqd_avx2(local_460,local_460);
                      local_440 = context->user->instID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_420 = context->user->instPrimID[0];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      *(float *)(ray + k * 4 + 0x100) = fVar213;
                      local_9e0 = local_7c0;
                      local_af0.valid = (int *)local_9e0;
                      local_af0.geometryUserPtr = pGVar2->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = (RTCHitN *)local_520;
                      local_af0.N = 8;
                      local_af0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar239 = ZEXT1664(auVar88);
                        auVar267 = ZEXT1664(auVar162);
                        auVar281 = ZEXT1664(auVar198);
                        auVar287 = ZEXT1664(auVar287._0_16_);
                        (*pGVar2->occlusionFilterN)(&local_af0);
                        auVar234 = ZEXT3264(_local_ac0);
                        auVar142 = ZEXT3264(local_aa0);
                        auVar150 = ZEXT816(0) << 0x40;
                      }
                      auVar160 = ZEXT1632(auVar150);
                      auVar101 = vpcmpeqd_avx2(local_9e0,auVar160);
                      auVar101 = _DAT_01f7b020 & ~auVar101;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar101 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar101 >> 0x7f,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar101 >> 0xbf,0) != '\0') ||
                          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar101[0x1f] < '\0') {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar239 = ZEXT1664(auVar239._0_16_);
                          auVar267 = ZEXT1664(auVar267._0_16_);
                          auVar281 = ZEXT1664(auVar281._0_16_);
                          auVar287 = ZEXT1664(auVar287._0_16_);
                          (*p_Var3)(&local_af0);
                          auVar234 = ZEXT3264(_local_ac0);
                          auVar142 = ZEXT3264(local_aa0);
                          auVar160 = ZEXT832(0) << 0x40;
                        }
                        auVar160 = vpcmpeqd_avx2(local_9e0,auVar160);
                        auVar134._8_4_ = 0xff800000;
                        auVar134._0_8_ = 0xff800000ff800000;
                        auVar134._12_4_ = 0xff800000;
                        auVar134._16_4_ = 0xff800000;
                        auVar134._20_4_ = 0xff800000;
                        auVar134._24_4_ = 0xff800000;
                        auVar134._28_4_ = 0xff800000;
                        auVar101 = vblendvps_avx(auVar134,*(undefined1 (*) [32])
                                                           (local_af0.ray + 0x100),auVar160);
                        *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar101;
                        auVar101 = _DAT_01f7b020 & ~auVar160;
                        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar101 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar101 >> 0x7f,0) != '\0')
                              || (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar101 >> 0xbf,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar101[0x1f] < '\0') {
                          bVar74 = 1;
                          goto LAB_01171c5a;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar214;
                    }
                  }
                  bVar74 = 0;
                  goto LAB_01171c5a;
                }
              }
            }
            bVar85 = false;
LAB_01171c3f:
            auVar142 = ZEXT3264(local_aa0);
            auVar234 = ZEXT3264(_local_ac0);
LAB_01171c5a:
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar256._4_4_ = uVar84;
            auVar256._0_4_ = uVar84;
            auVar256._8_4_ = uVar84;
            auVar256._12_4_ = uVar84;
            auVar256._16_4_ = uVar84;
            auVar256._20_4_ = uVar84;
            auVar256._24_4_ = uVar84;
            auVar256._28_4_ = uVar84;
            auVar251 = ZEXT3264(auVar256);
            bVar82 = bVar82 | bVar85 & bVar74;
            auVar101 = vcmpps_avx(_local_900,auVar256,2);
            local_580 = vandps_avx(auVar101,local_580);
          }
          auVar113._0_4_ = (float)local_980._0_4_ + auVar142._0_4_;
          auVar113._4_4_ = (float)local_980._4_4_ + auVar142._4_4_;
          auVar113._8_4_ = fStack_978 + auVar142._8_4_;
          auVar113._12_4_ = fStack_974 + auVar142._12_4_;
          auVar113._16_4_ = fStack_970 + auVar142._16_4_;
          auVar113._20_4_ = fStack_96c + auVar142._20_4_;
          auVar113._24_4_ = fStack_968 + auVar142._24_4_;
          auVar113._28_4_ = fStack_964 + auVar142._28_4_;
          uVar84 = auVar251._0_4_;
          auVar135._4_4_ = uVar84;
          auVar135._0_4_ = uVar84;
          auVar135._8_4_ = uVar84;
          auVar135._12_4_ = uVar84;
          auVar135._16_4_ = uVar84;
          auVar135._20_4_ = uVar84;
          auVar135._24_4_ = uVar84;
          auVar135._28_4_ = uVar84;
          auVar160 = vcmpps_avx(auVar113,auVar135,2);
          local_aa0 = vandps_avx(auVar160,auVar234._0_32_);
          auVar114._8_4_ = 3;
          auVar114._0_8_ = 0x300000003;
          auVar114._12_4_ = 3;
          auVar114._16_4_ = 3;
          auVar114._20_4_ = 3;
          auVar114._24_4_ = 3;
          auVar114._28_4_ = 3;
          auVar136._8_4_ = 2;
          auVar136._0_8_ = 0x200000002;
          auVar136._12_4_ = 2;
          auVar136._16_4_ = 2;
          auVar136._20_4_ = 2;
          auVar136._24_4_ = 2;
          auVar136._28_4_ = 2;
          auVar160 = vblendvps_avx(auVar136,auVar114,local_840);
          _local_900 = vpcmpgtd_avx2(auVar160,local_860);
          local_5a0 = vpandn_avx2(_local_900,local_aa0);
          local_ac0._4_4_ = (float)local_980._4_4_ + (float)local_400._4_4_;
          local_ac0._0_4_ = (float)local_980._0_4_ + (float)local_400._0_4_;
          fStack_ab8 = fStack_978 + fStack_3f8;
          fStack_ab4 = fStack_974 + fStack_3f4;
          fStack_ab0 = fStack_970 + fStack_3f0;
          fStack_aac = fStack_96c + fStack_3ec;
          fStack_aa8 = fStack_968 + fStack_3e8;
          fStack_aa4 = fStack_964 + fStack_3e4;
          for (; (((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_5a0 >> 0x7f,0) != '\0') ||
                   (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_5a0 >> 0xbf,0) != '\0') ||
                 (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_5a0[0x1f] < '\0'; local_5a0 = vandps_avx(auVar160,local_5a0)) {
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar160 = vblendvps_avx(auVar137,auVar101,local_5a0);
            auVar102 = vshufps_avx(auVar160,auVar160,0xb1);
            auVar102 = vminps_avx(auVar160,auVar102);
            auVar280 = vshufpd_avx(auVar102,auVar102,5);
            auVar102 = vminps_avx(auVar102,auVar280);
            auVar280 = vpermpd_avx2(auVar102,0x4e);
            auVar102 = vminps_avx(auVar102,auVar280);
            auVar102 = vcmpps_avx(auVar160,auVar102,0);
            auVar280 = local_5a0 & auVar102;
            auVar160 = local_5a0;
            if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar280 >> 0x7f,0) != '\0') ||
                  (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar280 >> 0xbf,0) != '\0') ||
                (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar280[0x1f] < '\0') {
              auVar160 = vandps_avx(auVar102,local_5a0);
            }
            uVar76 = vmovmskps_avx(auVar160);
            iVar75 = 0;
            for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar75 = iVar75 + 1;
            }
            uVar79 = (ulong)(uint)(iVar75 << 2);
            *(undefined4 *)(local_5a0 + uVar79) = 0;
            uVar76 = *(uint *)(local_1c0 + uVar79);
            uVar81 = *(uint *)(local_3e0 + uVar79);
            fVar197 = auVar5._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              auVar239 = ZEXT1664(auVar239._0_16_);
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar281 = ZEXT1664(auVar281._0_16_);
              auVar287 = ZEXT1664(auVar287._0_16_);
              fVar197 = sqrtf((float)local_a40._0_4_);
              uVar79 = extraout_RAX_03;
            }
            auVar234 = ZEXT464(uVar81);
            auVar88 = vminps_avx(auVar7,auVar9);
            auVar89 = vmaxps_avx(auVar7,auVar9);
            auVar148 = vminps_avx(auVar8,auVar6);
            auVar120 = vminps_avx(auVar88,auVar148);
            auVar88 = vmaxps_avx(auVar8,auVar6);
            auVar148 = vmaxps_avx(auVar89,auVar88);
            auVar89 = vandps_avx(auVar120,auVar236);
            auVar88 = vandps_avx(auVar148,auVar236);
            auVar89 = vmaxps_avx(auVar89,auVar88);
            auVar88 = vmovshdup_avx(auVar89);
            auVar88 = vmaxss_avx(auVar88,auVar89);
            auVar89 = vshufpd_avx(auVar89,auVar89,1);
            auVar89 = vmaxss_avx(auVar89,auVar88);
            local_a00._0_4_ = auVar89._0_4_ * 1.9073486e-06;
            local_8c0._0_4_ = fVar197 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar148,auVar148,0xff);
            auVar89 = vinsertps_avx(ZEXT416(uVar81),ZEXT416(uVar76),0x10);
            for (uVar83 = 0; bVar74 = (byte)uVar79, uVar83 != 5; uVar83 = uVar83 + 1) {
              fVar217 = auVar89._0_4_;
              auVar95._4_4_ = fVar217;
              auVar95._0_4_ = fVar217;
              auVar95._8_4_ = fVar217;
              auVar95._12_4_ = fVar217;
              auVar120 = vfmadd213ps_fma(auVar95,local_a30,_DAT_01f45a50);
              auVar148 = vmovshdup_avx(auVar89);
              fVar218 = auVar148._0_4_;
              fVar216 = 1.0 - fVar218;
              auVar91 = SUB6416(ZEXT464(0x40400000),0);
              auVar162 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar87 = vfmadd213ss_fma(auVar91,auVar148,auVar162);
              auVar88 = vfmadd213ss_fma(auVar87,ZEXT416((uint)(fVar218 * fVar218)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar143 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar216),auVar162);
              auVar143 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(fVar216 * fVar216)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar197 = fVar216 * fVar216 * -fVar218 * 0.5;
              fVar213 = auVar88._0_4_ * 0.5;
              fVar214 = auVar143._0_4_ * 0.5;
              fVar215 = fVar218 * fVar218 * -fVar216 * 0.5;
              auVar169._0_4_ = fVar215 * fVar118;
              auVar169._4_4_ = fVar215 * fStack_b7c;
              auVar169._8_4_ = fVar215 * fStack_b78;
              auVar169._12_4_ = fVar215 * fStack_b74;
              auVar191._4_4_ = fVar214;
              auVar191._0_4_ = fVar214;
              auVar191._8_4_ = fVar214;
              auVar191._12_4_ = fVar214;
              auVar88 = vfmadd132ps_fma(auVar191,auVar169,auVar8);
              auVar151._4_4_ = fVar213;
              auVar151._0_4_ = fVar213;
              auVar151._8_4_ = fVar213;
              auVar151._12_4_ = fVar213;
              auVar88 = vfmadd132ps_fma(auVar151,auVar88,auVar9);
              auVar170._4_4_ = fVar197;
              auVar170._0_4_ = fVar197;
              auVar170._8_4_ = fVar197;
              auVar170._12_4_ = fVar197;
              local_920 = vfmadd132ps_fma(auVar170,auVar88,auVar7);
              auVar187 = vfmadd231ss_fma(auVar162,auVar148,ZEXT416(0x41100000));
              auVar143 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar148,ZEXT416(0x40800000)
                                        );
              auVar120 = vsubps_avx(auVar120,local_920);
              auVar88 = vdpps_avx(auVar120,auVar120,0x7f);
              auVar162 = vfmadd213ss_fma(auVar91,auVar148,ZEXT416(0xbf800000));
              fVar197 = auVar88._0_4_;
              if (fVar197 < 0.0) {
                local_a60._0_16_ = auVar187;
                local_a80._0_4_ = fVar216 * -2.0;
                auVar281._0_4_ = sqrtf(fVar197);
                auVar281._4_60_ = extraout_var_00;
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar91 = auVar281._0_16_;
                uVar79 = extraout_RAX_04;
                fVar213 = (float)local_a80._0_4_;
                auVar187 = local_a60._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(auVar88,auVar88);
                fVar213 = fVar216 * -2.0;
              }
              auVar287 = ZEXT1664(auVar187);
              auVar119 = vfmadd213ss_fma(auVar87,ZEXT416((uint)(fVar218 + fVar218)),
                                         ZEXT416((uint)(fVar218 * fVar218 * 3.0)));
              auVar199 = SUB6416(ZEXT464(0x40000000),0);
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar148,auVar199);
              auVar186 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216 * -3.0)),
                                         ZEXT416((uint)(fVar216 + fVar216)),auVar87);
              auVar198 = vfnmadd231ss_fma(ZEXT416((uint)(fVar218 * (fVar216 + fVar216))),
                                          ZEXT416((uint)fVar216),ZEXT416((uint)fVar216));
              auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar213),auVar148,
                                        ZEXT416((uint)(fVar218 * fVar218)));
              fVar213 = auVar186._0_4_ * 0.5;
              fVar214 = auVar87._0_4_ * 0.5;
              auVar152._0_4_ = fVar118 * fVar214;
              auVar152._4_4_ = fStack_b7c * fVar214;
              auVar152._8_4_ = fStack_b78 * fVar214;
              auVar152._12_4_ = fStack_b74 * fVar214;
              auVar125._4_4_ = fVar213;
              auVar125._0_4_ = fVar213;
              auVar125._8_4_ = fVar213;
              auVar125._12_4_ = fVar213;
              auVar87 = vfmadd213ps_fma(auVar125,auVar8,auVar152);
              fVar213 = auVar198._0_4_ * 0.5;
              fVar214 = auVar119._0_4_ * 0.5;
              auVar153._4_4_ = fVar214;
              auVar153._0_4_ = fVar214;
              auVar153._8_4_ = fVar214;
              auVar153._12_4_ = fVar214;
              auVar87 = vfmadd213ps_fma(auVar153,auVar9,auVar87);
              auVar254._4_4_ = fVar213;
              auVar254._0_4_ = fVar213;
              auVar254._8_4_ = fVar213;
              auVar254._12_4_ = fVar213;
              auVar119 = vfmadd213ps_fma(auVar254,auVar7,auVar87);
              auVar186 = vfmadd213ss_fma(auVar148,SUB6416(ZEXT464(0xc0400000),0),auVar199);
              local_c00 = auVar162._0_4_;
              auVar96._0_4_ = fVar118 * local_c00;
              auVar96._4_4_ = fStack_b7c * local_c00;
              auVar96._8_4_ = fStack_b78 * local_c00;
              auVar96._12_4_ = fStack_b74 * local_c00;
              local_b20 = auVar143._0_4_;
              auVar126._4_4_ = local_b20;
              auVar126._0_4_ = local_b20;
              auVar126._8_4_ = local_b20;
              auVar126._12_4_ = local_b20;
              auVar148 = vfmadd213ps_fma(auVar126,auVar8,auVar96);
              uVar84 = auVar187._0_4_;
              auVar154._4_4_ = uVar84;
              auVar154._0_4_ = uVar84;
              auVar154._8_4_ = uVar84;
              auVar154._12_4_ = uVar84;
              auVar148 = vfmadd213ps_fma(auVar154,auVar9,auVar148);
              auVar87 = vdpps_avx(auVar119,auVar119,0x7f);
              uVar84 = auVar186._0_4_;
              auVar127._4_4_ = uVar84;
              auVar127._0_4_ = uVar84;
              auVar127._8_4_ = uVar84;
              auVar127._12_4_ = uVar84;
              auVar162 = vfmadd213ps_fma(auVar127,auVar7,auVar148);
              auVar148 = vblendps_avx(auVar87,_DAT_01f45a50,0xe);
              auVar143 = vrsqrtss_avx(auVar148,auVar148);
              fVar215 = auVar87._0_4_;
              fVar213 = auVar143._0_4_;
              auVar143 = vdpps_avx(auVar119,auVar162,0x7f);
              fVar213 = fVar213 * 1.5 + fVar215 * -0.5 * fVar213 * fVar213 * fVar213;
              auVar128._0_4_ = auVar162._0_4_ * fVar215;
              auVar128._4_4_ = auVar162._4_4_ * fVar215;
              auVar128._8_4_ = auVar162._8_4_ * fVar215;
              auVar128._12_4_ = auVar162._12_4_ * fVar215;
              fVar214 = auVar143._0_4_;
              auVar203._0_4_ = auVar119._0_4_ * fVar214;
              auVar203._4_4_ = auVar119._4_4_ * fVar214;
              fVar216 = auVar119._8_4_;
              auVar203._8_4_ = fVar216 * fVar214;
              fVar218 = auVar119._12_4_;
              auVar203._12_4_ = fVar218 * fVar214;
              auVar143 = vsubps_avx(auVar128,auVar203);
              auVar148 = vrcpss_avx(auVar148,auVar148);
              auVar162 = vfnmadd213ss_fma(auVar148,auVar87,auVar199);
              fVar214 = auVar148._0_4_ * auVar162._0_4_;
              auVar148 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                    ZEXT416((uint)(fVar217 * (float)local_8c0._0_4_)));
              auVar251 = ZEXT1664(auVar148);
              auVar237._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = -fVar216;
              auVar237._12_4_ = -fVar218;
              auVar171._0_4_ = fVar213 * auVar143._0_4_ * fVar214;
              auVar171._4_4_ = fVar213 * auVar143._4_4_ * fVar214;
              auVar171._8_4_ = fVar213 * auVar143._8_4_ * fVar214;
              auVar171._12_4_ = fVar213 * auVar143._12_4_ * fVar214;
              auVar246._0_4_ = auVar119._0_4_ * fVar213;
              auVar246._4_4_ = auVar119._4_4_ * fVar213;
              auVar246._8_4_ = fVar216 * fVar213;
              auVar246._12_4_ = fVar218 * fVar213;
              if (fVar215 < -fVar215) {
                auVar287 = ZEXT1664(auVar187);
                fVar213 = sqrtf(fVar215);
                auVar251 = ZEXT464(auVar148._0_4_);
                auVar91 = ZEXT416(auVar91._0_4_);
                uVar79 = extraout_RAX_05;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar213 = auVar87._0_4_;
              }
              auVar87 = vdpps_avx(auVar120,auVar246,0x7f);
              auVar186 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar91,auVar251._0_16_);
              auVar143 = vdpps_avx(auVar237,auVar246,0x7f);
              auVar162 = vdpps_avx(auVar120,auVar171,0x7f);
              auVar187 = vdpps_avx(local_a30,auVar246,0x7f);
              auVar186 = vfmadd213ss_fma(ZEXT416((uint)(auVar91._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_a00._0_4_ / fVar213)),auVar186)
              ;
              fVar213 = auVar143._0_4_ + auVar162._0_4_;
              auVar267 = ZEXT464((uint)fVar213);
              fVar215 = auVar87._0_4_;
              auVar97._0_4_ = fVar215 * fVar215;
              auVar97._4_4_ = auVar87._4_4_ * auVar87._4_4_;
              auVar97._8_4_ = auVar87._8_4_ * auVar87._8_4_;
              auVar97._12_4_ = auVar87._12_4_ * auVar87._12_4_;
              auVar143 = vdpps_avx(auVar120,auVar237,0x7f);
              auVar91 = vsubps_avx(auVar88,auVar97);
              auVar162 = vrsqrtss_avx(auVar91,auVar91);
              fVar216 = auVar91._0_4_;
              fVar214 = auVar162._0_4_;
              fVar214 = fVar214 * 1.5 + fVar216 * -0.5 * fVar214 * fVar214 * fVar214;
              auVar162 = vdpps_avx(auVar120,local_a30,0x7f);
              auVar143 = vfnmadd231ss_fma(auVar143,auVar87,ZEXT416((uint)fVar213));
              auVar162 = vfnmadd231ss_fma(auVar162,auVar87,auVar187);
              if (fVar216 < 0.0) {
                local_a60._0_16_ = auVar143;
                local_a80._0_4_ = fVar214;
                local_a20._0_16_ = auVar162;
                auVar287 = ZEXT1664(auVar287._0_16_);
                fVar216 = sqrtf(fVar216);
                auVar267 = ZEXT1664(ZEXT416((uint)fVar213));
                auVar251 = ZEXT464(auVar148._0_4_);
                uVar79 = extraout_RAX_06;
                fVar214 = (float)local_a80._0_4_;
                auVar162 = local_a20._0_16_;
                auVar143 = local_a60._0_16_;
              }
              else {
                auVar148 = vsqrtss_avx(auVar91,auVar91);
                fVar216 = auVar148._0_4_;
              }
              auVar234 = ZEXT1664(auVar88);
              auVar239 = ZEXT1664(auVar119);
              auVar148 = vpermilps_avx(local_920,0xff);
              fVar216 = fVar216 - auVar148._0_4_;
              auVar91 = vshufps_avx(auVar119,auVar119,0xff);
              auVar198 = vfmsub213ss_fma(auVar143,ZEXT416((uint)fVar214),auVar91);
              auVar281 = ZEXT1664(auVar198);
              auVar172._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
              auVar172._8_4_ = auVar187._8_4_ ^ 0x80000000;
              auVar172._12_4_ = auVar187._12_4_ ^ 0x80000000;
              auVar192._0_8_ = auVar198._0_8_ ^ 0x8000000080000000;
              auVar192._8_4_ = auVar198._8_4_ ^ 0x80000000;
              auVar192._12_4_ = auVar198._12_4_ ^ 0x80000000;
              auVar148 = ZEXT416((uint)(auVar162._0_4_ * fVar214));
              auVar162 = auVar267._0_16_;
              auVar143 = vfmsub231ss_fma(ZEXT416((uint)(auVar187._0_4_ * auVar198._0_4_)),auVar162,
                                         auVar148);
              auVar148 = vinsertps_avx(auVar192,auVar148,0x1c);
              uVar84 = auVar143._0_4_;
              auVar193._4_4_ = uVar84;
              auVar193._0_4_ = uVar84;
              auVar193._8_4_ = uVar84;
              auVar193._12_4_ = uVar84;
              auVar148 = vdivps_avx(auVar148,auVar193);
              auVar143 = vinsertps_avx(auVar162,auVar172,0x10);
              auVar143 = vdivps_avx(auVar143,auVar193);
              auVar155._0_4_ = fVar215 * auVar148._0_4_ + fVar216 * auVar143._0_4_;
              auVar155._4_4_ = fVar215 * auVar148._4_4_ + fVar216 * auVar143._4_4_;
              auVar155._8_4_ = fVar215 * auVar148._8_4_ + fVar216 * auVar143._8_4_;
              auVar155._12_4_ = fVar215 * auVar148._12_4_ + fVar216 * auVar143._12_4_;
              auVar89 = vsubps_avx(auVar89,auVar155);
              auVar148 = vandps_avx(auVar87,auVar236);
              if (auVar148._0_4_ < auVar186._0_4_) {
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar186._0_4_ + auVar251._0_4_)),
                                          local_8e0._0_16_,ZEXT416(0x36000000));
                auVar148 = vandps_avx(ZEXT416((uint)fVar216),auVar236);
                if (auVar148._0_4_ < auVar87._0_4_) {
                  bVar85 = uVar83 < 5;
                  fVar213 = auVar89._0_4_ + (float)local_9b0._0_4_;
                  if ((fVar86 <= fVar213) &&
                     (fVar214 = *(float *)(ray + k * 4 + 0x100), fVar213 <= fVar214)) {
                    auVar89 = vmovshdup_avx(auVar89);
                    bVar74 = 0;
                    if ((auVar89._0_4_ < 0.0) || (1.0 < auVar89._0_4_)) goto LAB_01172780;
                    auVar148 = vrsqrtss_avx(auVar88,auVar88);
                    fVar215 = auVar148._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar77].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar74 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01172780;
                      fVar197 = fVar215 * 1.5 + fVar197 * -0.5 * fVar215 * fVar215 * fVar215;
                      local_bc0 = auVar120._0_4_;
                      fStack_bbc = auVar120._4_4_;
                      fStack_bb8 = auVar120._8_4_;
                      fStack_bb4 = auVar120._12_4_;
                      auVar173._0_4_ = fVar197 * local_bc0;
                      auVar173._4_4_ = fVar197 * fStack_bbc;
                      auVar173._8_4_ = fVar197 * fStack_bb8;
                      auVar173._12_4_ = fVar197 * fStack_bb4;
                      auVar143 = vfmadd213ps_fma(auVar91,auVar173,auVar119);
                      auVar148 = vshufps_avx(auVar173,auVar173,0xc9);
                      auVar120 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar174._0_4_ = auVar173._0_4_ * auVar120._0_4_;
                      auVar174._4_4_ = auVar173._4_4_ * auVar120._4_4_;
                      auVar174._8_4_ = auVar173._8_4_ * auVar120._8_4_;
                      auVar174._12_4_ = auVar173._12_4_ * auVar120._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar174,auVar119,auVar148);
                      auVar148 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar120 = vshufps_avx(auVar143,auVar143,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar98._0_4_ = auVar143._0_4_ * auVar87._0_4_;
                      auVar98._4_4_ = auVar143._4_4_ * auVar87._4_4_;
                      auVar98._8_4_ = auVar143._8_4_ * auVar87._8_4_;
                      auVar98._12_4_ = auVar143._12_4_ * auVar87._12_4_;
                      auVar148 = vfmsub231ps_fma(auVar98,auVar148,auVar120);
                      local_4c0 = auVar89._0_8_;
                      auVar89 = vmovshdup_avx(auVar148);
                      local_520._8_8_ = auVar89._0_8_;
                      auVar89 = vshufps_avx(auVar148,auVar148,0xaa);
                      local_500 = auVar89._0_8_;
                      local_4e0 = auVar148._0_4_;
                      local_520._0_8_ = local_520._8_8_;
                      local_520._16_8_ = local_520._8_8_;
                      local_520._24_8_ = local_520._8_8_;
                      uStack_4f8 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4e8 = local_500;
                      uStack_4dc = local_4e0;
                      uStack_4d8 = local_4e0;
                      uStack_4d4 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4cc = local_4e0;
                      uStack_4c8 = local_4e0;
                      uStack_4c4 = local_4e0;
                      uStack_4b8 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4a8 = local_4c0;
                      auVar156._12_4_ = 0;
                      auVar156._0_12_ = ZEXT812(0);
                      auVar156 = auVar156 << 0x20;
                      local_4a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_480 = CONCAT44(uStack_79c,local_7a0);
                      uStack_478 = CONCAT44(uStack_794,uStack_798);
                      uStack_470 = CONCAT44(uStack_78c,uStack_790);
                      uStack_468 = CONCAT44(uStack_784,uStack_788);
                      local_460._4_4_ = uStack_77c;
                      local_460._0_4_ = local_780;
                      local_460._8_4_ = uStack_778;
                      local_460._12_4_ = uStack_774;
                      local_460._16_4_ = uStack_770;
                      local_460._20_4_ = uStack_76c;
                      local_460._24_4_ = uStack_768;
                      local_460._28_4_ = uStack_764;
                      vpcmpeqd_avx2(local_460,local_460);
                      local_440 = context->user->instID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_420 = context->user->instPrimID[0];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      *(float *)(ray + k * 4 + 0x100) = fVar213;
                      local_9e0 = local_7c0;
                      local_af0.valid = (int *)local_9e0;
                      local_af0.geometryUserPtr = pGVar2->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = (RTCHitN *)local_520;
                      local_af0.N = 8;
                      local_af0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar234 = ZEXT1664(auVar88);
                        auVar239 = ZEXT1664(auVar119);
                        auVar267 = ZEXT1664(auVar162);
                        auVar281 = ZEXT1664(auVar198);
                        auVar287 = ZEXT1664(auVar287._0_16_);
                        (*pGVar2->occlusionFilterN)(&local_af0);
                        auVar156 = ZEXT816(0) << 0x40;
                      }
                      auVar102 = ZEXT1632(auVar156);
                      auVar160 = vpcmpeqd_avx2(local_9e0,auVar102);
                      auVar160 = _DAT_01f7b020 & ~auVar160;
                      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar160 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar160 >> 0x7f,0) != '\0') ||
                            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar160 >> 0xbf,0) != '\0') ||
                          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar160[0x1f] < '\0') {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar234 = ZEXT1664(auVar234._0_16_);
                          auVar239 = ZEXT1664(auVar239._0_16_);
                          auVar267 = ZEXT1664(auVar267._0_16_);
                          auVar281 = ZEXT1664(auVar281._0_16_);
                          auVar287 = ZEXT1664(auVar287._0_16_);
                          (*p_Var3)(&local_af0);
                          auVar102 = ZEXT832(0) << 0x40;
                        }
                        auVar102 = vpcmpeqd_avx2(local_9e0,auVar102);
                        auVar138._8_4_ = 0xff800000;
                        auVar138._0_8_ = 0xff800000ff800000;
                        auVar138._12_4_ = 0xff800000;
                        auVar138._16_4_ = 0xff800000;
                        auVar138._20_4_ = 0xff800000;
                        auVar138._24_4_ = 0xff800000;
                        auVar138._28_4_ = 0xff800000;
                        auVar160 = vblendvps_avx(auVar138,*(undefined1 (*) [32])
                                                           (local_af0.ray + 0x100),auVar102);
                        *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar160;
                        auVar160 = _DAT_01f7b020 & ~auVar102;
                        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar160 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar160 >> 0x7f,0) != '\0')
                              || (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar160 >> 0xbf,0) != '\0') ||
                            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar160[0x1f] < '\0') {
                          bVar74 = 1;
                          goto LAB_01172780;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar214;
                    }
                  }
                  bVar74 = 0;
                  goto LAB_01172780;
                }
              }
            }
            bVar85 = false;
LAB_01172780:
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar257._4_4_ = uVar84;
            auVar257._0_4_ = uVar84;
            auVar257._8_4_ = uVar84;
            auVar257._12_4_ = uVar84;
            auVar257._16_4_ = uVar84;
            auVar257._20_4_ = uVar84;
            auVar257._24_4_ = uVar84;
            auVar257._28_4_ = uVar84;
            auVar251 = ZEXT3264(auVar257);
            bVar82 = bVar82 | bVar85 & bVar74;
            auVar160 = vcmpps_avx(_local_ac0,auVar257,2);
          }
          auVar139._0_4_ = local_980._0_4_ + local_560._0_4_;
          auVar139._4_4_ = local_980._4_4_ + local_560._4_4_;
          auVar139._8_4_ = local_980._8_4_ + local_560._8_4_;
          auVar139._12_4_ = local_980._12_4_ + local_560._12_4_;
          auVar139._16_4_ = local_980._16_4_ + local_560._16_4_;
          auVar139._20_4_ = local_980._20_4_ + local_560._20_4_;
          auVar139._24_4_ = local_980._24_4_ + local_560._24_4_;
          auVar139._28_4_ = local_980._28_4_ + local_560._28_4_;
          uVar84 = auVar251._0_4_;
          auVar178._4_4_ = uVar84;
          auVar178._0_4_ = uVar84;
          auVar178._8_4_ = uVar84;
          auVar178._12_4_ = uVar84;
          auVar178._16_4_ = uVar84;
          auVar178._20_4_ = uVar84;
          auVar178._24_4_ = uVar84;
          auVar178._28_4_ = uVar84;
          auVar258 = ZEXT3264(_local_980);
          auVar160 = vcmpps_avx(auVar139,auVar178,2);
          auVar101 = vandps_avx(local_820,local_800);
          auVar101 = vandps_avx(auVar160,auVar101);
          auVar195._0_4_ = local_980._0_4_ + local_400._0_4_;
          auVar195._4_4_ = local_980._4_4_ + local_400._4_4_;
          auVar195._8_4_ = local_980._8_4_ + local_400._8_4_;
          auVar195._12_4_ = local_980._12_4_ + local_400._12_4_;
          auVar195._16_4_ = local_980._16_4_ + local_400._16_4_;
          auVar195._20_4_ = local_980._20_4_ + local_400._20_4_;
          auVar195._24_4_ = local_980._24_4_ + local_400._24_4_;
          auVar195._28_4_ = local_980._28_4_ + local_400._28_4_;
          auVar102 = vcmpps_avx(auVar195,auVar178,2);
          auVar160 = vandps_avx(_local_900,local_aa0);
          auVar160 = vandps_avx(auVar102,auVar160);
          auVar160 = vorps_avx(auVar101,auVar160);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar160;
            auVar101 = vblendvps_avx(_local_400,local_560,auVar101);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar101;
            uVar79 = vmovlps_avx(local_7d0);
            (&uStack_140)[uVar78 * 0xc] = uVar79;
            aiStack_138[uVar78 * 0x18] = local_ce4 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
          auVar251 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
      }
    }
    while( true ) {
      uVar76 = (uint)uVar78;
      if (uVar76 == 0) {
        if (bVar82 != 0) goto LAB_01172d3f;
        uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar100._4_4_ = uVar84;
        auVar100._0_4_ = uVar84;
        auVar100._8_4_ = uVar84;
        auVar100._12_4_ = uVar84;
        auVar4 = vcmpps_avx(local_7e0,auVar100,2);
        uVar77 = vmovmskps_avx(auVar4);
        local_988 = (ulong)((uint)local_990 & uVar77);
        goto LAB_01170495;
      }
      uVar78 = (ulong)(uVar76 - 1);
      lVar80 = uVar78 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar115._0_4_ = auVar258._0_4_ + auVar101._0_4_;
      auVar115._4_4_ = auVar258._4_4_ + auVar101._4_4_;
      auVar115._8_4_ = auVar258._8_4_ + auVar101._8_4_;
      auVar115._12_4_ = auVar258._12_4_ + auVar101._12_4_;
      auVar115._16_4_ = auVar258._16_4_ + auVar101._16_4_;
      auVar115._20_4_ = auVar258._20_4_ + auVar101._20_4_;
      auVar115._24_4_ = auVar258._24_4_ + auVar101._24_4_;
      auVar115._28_4_ = auVar258._28_4_ + auVar101._28_4_;
      uVar84 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar179._4_4_ = uVar84;
      auVar179._0_4_ = uVar84;
      auVar179._8_4_ = uVar84;
      auVar179._12_4_ = uVar84;
      auVar179._16_4_ = uVar84;
      auVar179._20_4_ = uVar84;
      auVar179._24_4_ = uVar84;
      auVar179._28_4_ = uVar84;
      auVar102 = vcmpps_avx(auVar115,auVar179,2);
      auVar160 = vandps_avx(auVar102,*(undefined1 (*) [32])(auStack_180 + lVar80));
      local_520 = auVar160;
      auVar102 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar102;
      if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0x7f,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0xbf,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar102[0x1f] < '\0') break;
      uVar78 = (ulong)(uVar76 - 1);
    }
    auVar161._8_4_ = 0x7f800000;
    auVar161._0_8_ = 0x7f8000007f800000;
    auVar161._12_4_ = 0x7f800000;
    auVar161._16_4_ = 0x7f800000;
    auVar161._20_4_ = 0x7f800000;
    auVar161._24_4_ = 0x7f800000;
    auVar161._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar161,auVar101,auVar160);
    auVar102 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar102 = vminps_avx(auVar101,auVar102);
    auVar280 = vshufpd_avx(auVar102,auVar102,5);
    auVar102 = vminps_avx(auVar102,auVar280);
    auVar280 = vpermpd_avx2(auVar102,0x4e);
    auVar102 = vminps_avx(auVar102,auVar280);
    auVar101 = vcmpps_avx(auVar101,auVar102,0);
    auVar102 = auVar160 & auVar101;
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0x7f,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar102 >> 0xbf,0) != '\0') ||
        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar102[0x1f] < '\0') {
      auVar160 = vandps_avx(auVar101,auVar160);
    }
    uVar81 = vmovmskps_avx(auVar160);
    iVar75 = 0;
    for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
      iVar75 = iVar75 + 1;
    }
    *(undefined4 *)(local_520 + (uint)(iVar75 << 2)) = 0;
    uVar79 = (&uStack_140)[uVar78 * 0xc];
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar79;
    local_ce4 = aiStack_138[uVar78 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar80) = local_520;
    uVar81 = uVar76 - 1;
    if ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_520 >> 0x7f,0) != '\0') ||
          (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_520 >> 0xbf,0) != '\0') ||
        (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_520[0x1f] < '\0') {
      uVar81 = uVar76;
    }
    uVar84 = (undefined4)uVar79;
    auVar140._4_4_ = uVar84;
    auVar140._0_4_ = uVar84;
    auVar140._8_4_ = uVar84;
    auVar140._12_4_ = uVar84;
    auVar140._16_4_ = uVar84;
    auVar140._20_4_ = uVar84;
    auVar140._24_4_ = uVar84;
    auVar140._28_4_ = uVar84;
    auVar89 = vmovshdup_avx(auVar99);
    auVar89 = vsubps_avx(auVar89,auVar99);
    auVar116._0_4_ = auVar89._0_4_;
    auVar116._4_4_ = auVar116._0_4_;
    auVar116._8_4_ = auVar116._0_4_;
    auVar116._12_4_ = auVar116._0_4_;
    auVar116._16_4_ = auVar116._0_4_;
    auVar116._20_4_ = auVar116._0_4_;
    auVar116._24_4_ = auVar116._0_4_;
    auVar116._28_4_ = auVar116._0_4_;
    auVar89 = vfmadd132ps_fma(auVar116,auVar140,_DAT_01f7b040);
    local_560 = ZEXT1632(auVar89);
    auVar142 = ZEXT864(*(ulong *)(local_560 + (uint)(iVar75 << 2)));
    uVar78 = (ulong)uVar81;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }